

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroska_sem.c
# Opt level: O0

void MATROSKA_InitSemantic(void)

{
  undefined4 local_3098;
  undefined4 local_3094;
  undefined8 local_3090;
  undefined8 local_3088;
  char *local_3080;
  ebml_semantic *local_3078;
  ebml_semantic *local_3070;
  undefined4 local_3068;
  undefined4 local_3064;
  undefined8 local_3060;
  undefined8 local_3058;
  char *local_3050;
  ebml_semantic *local_3048;
  ebml_semantic *local_3040;
  undefined4 local_3038;
  undefined4 local_3034;
  undefined8 local_3030;
  undefined8 local_3028;
  char *local_3020;
  ebml_semantic *local_3018;
  ebml_semantic *local_3010;
  undefined4 local_3008;
  undefined4 local_3004;
  undefined8 local_3000;
  undefined8 local_2ff8;
  char *local_2ff0;
  ebml_semantic *local_2fe8;
  ebml_semantic *local_2fe0;
  undefined4 local_2fd8;
  undefined4 local_2fd4;
  undefined8 local_2fd0;
  undefined8 local_2fc8;
  char *local_2fc0;
  undefined8 local_2fb8;
  ebml_semantic *local_2fb0;
  undefined4 local_2fa8;
  undefined4 local_2fa4;
  undefined8 local_2fa0;
  undefined8 local_2f98;
  char *local_2f90;
  undefined8 local_2f88;
  ebml_semantic *local_2f80;
  undefined4 local_2f78;
  undefined4 local_2f74;
  undefined8 local_2f70;
  undefined8 local_2f68;
  char *local_2f60;
  undefined8 local_2f58;
  ebml_semantic *local_2f50;
  undefined4 local_2f48;
  undefined4 local_2f44;
  undefined8 local_2f40;
  undefined8 local_2f38;
  char *local_2f30;
  undefined8 local_2f28;
  ebml_semantic *local_2f20;
  undefined4 local_2f18;
  undefined4 local_2f14;
  undefined8 local_2f10;
  undefined8 local_2f08;
  char *local_2f00;
  undefined8 local_2ef8;
  ebml_semantic *local_2ef0;
  undefined4 local_2ee8;
  undefined4 local_2ee4;
  undefined8 local_2ee0;
  char *local_2ed8;
  char *local_2ed0;
  undefined8 local_2ec8;
  ebml_semantic *local_2ec0;
  undefined4 local_2eb8;
  undefined4 local_2eb4;
  undefined8 local_2eb0;
  undefined8 local_2ea8;
  char *local_2ea0;
  undefined8 local_2e98;
  ebml_semantic *local_2e90;
  undefined4 local_2e88;
  undefined4 local_2e84;
  undefined8 local_2e80;
  undefined8 local_2e78;
  char *local_2e70;
  ebml_semantic *local_2e68;
  ebml_semantic *local_2e60;
  undefined4 local_2e58;
  undefined4 local_2e54;
  undefined8 local_2e50;
  undefined8 local_2e48;
  char *local_2e40;
  undefined8 local_2e38;
  ebml_semantic *local_2e30;
  undefined4 local_2e28;
  undefined4 local_2e24;
  undefined8 local_2e20;
  undefined8 local_2e18;
  char *local_2e10;
  undefined8 local_2e08;
  ebml_semantic *local_2e00;
  undefined4 local_2df8;
  undefined4 local_2df4;
  undefined8 local_2df0;
  undefined8 local_2de8;
  char *local_2de0;
  undefined8 local_2dd8;
  ebml_semantic *local_2dd0;
  undefined4 local_2dc8;
  undefined4 local_2dc4;
  undefined8 local_2dc0;
  undefined8 local_2db8;
  char *local_2db0;
  undefined8 local_2da8;
  ebml_semantic *local_2da0;
  undefined4 local_2d98;
  undefined4 local_2d94;
  undefined8 local_2d90;
  undefined8 local_2d88;
  char *local_2d80;
  undefined8 local_2d78;
  ebml_semantic *local_2d70;
  undefined4 local_2d68;
  undefined4 local_2d64;
  undefined8 local_2d60;
  undefined8 local_2d58;
  char *local_2d50;
  undefined8 local_2d48;
  ebml_semantic *local_2d40;
  undefined4 local_2d38;
  undefined4 local_2d34;
  undefined8 local_2d30;
  undefined8 local_2d28;
  char *local_2d20;
  ebml_semantic *local_2d18;
  ebml_semantic *local_2d10;
  undefined4 local_2d08;
  undefined4 local_2d04;
  undefined8 local_2d00;
  undefined8 local_2cf8;
  char *local_2cf0;
  ebml_semantic *local_2ce8;
  ebml_semantic *local_2ce0;
  undefined4 local_2cd8;
  undefined4 local_2cd4;
  undefined8 local_2cd0;
  undefined8 local_2cc8;
  char *local_2cc0;
  ebml_semantic *local_2cb8;
  ebml_semantic *local_2cb0;
  undefined4 local_2ca8;
  undefined4 local_2ca4;
  undefined8 local_2ca0;
  undefined8 local_2c98;
  char *local_2c90;
  ebml_semantic *local_2c88;
  ebml_semantic *local_2c80;
  undefined4 local_2c78;
  undefined4 local_2c74;
  undefined8 local_2c70;
  undefined8 local_2c68;
  char *local_2c60;
  ebml_semantic *local_2c58;
  ebml_semantic *local_2c50;
  undefined4 local_2c48;
  undefined4 local_2c44;
  undefined8 local_2c40;
  undefined8 local_2c38;
  char *local_2c30;
  undefined8 local_2c28;
  ebml_semantic *local_2c20;
  undefined4 local_2c18;
  undefined4 local_2c14;
  undefined8 local_2c10;
  undefined8 local_2c08;
  char *local_2c00;
  undefined8 local_2bf8;
  ebml_semantic *local_2bf0;
  undefined4 local_2be8;
  undefined4 local_2be4;
  undefined8 local_2be0;
  undefined8 local_2bd8;
  char *local_2bd0;
  undefined8 local_2bc8;
  ebml_semantic *local_2bc0;
  undefined4 local_2bb8;
  undefined4 local_2bb4;
  undefined8 local_2bb0;
  undefined8 local_2ba8;
  char *local_2ba0;
  undefined8 local_2b98;
  ebml_semantic *local_2b90;
  undefined4 local_2b88;
  undefined4 local_2b84;
  undefined8 local_2b80;
  undefined8 local_2b78;
  char *local_2b70;
  ebml_semantic *local_2b68;
  ebml_semantic *local_2b60;
  undefined4 local_2b58;
  undefined4 local_2b54;
  undefined8 local_2b50;
  undefined8 local_2b48;
  char *local_2b40;
  undefined8 local_2b38;
  ebml_semantic *local_2b30;
  undefined4 local_2b28;
  undefined4 local_2b24;
  undefined8 local_2b20;
  undefined8 local_2b18;
  char *local_2b10;
  undefined8 local_2b08;
  ebml_semantic *local_2b00;
  undefined4 local_2af8;
  undefined4 local_2af4;
  undefined8 local_2af0;
  char *local_2ae8;
  char *local_2ae0;
  undefined8 local_2ad8;
  ebml_semantic *local_2ad0;
  undefined4 local_2ac8;
  undefined4 local_2ac4;
  undefined8 local_2ac0;
  undefined8 local_2ab8;
  char *local_2ab0;
  undefined8 local_2aa8;
  ebml_semantic *local_2aa0;
  undefined4 local_2a98;
  undefined4 local_2a94;
  undefined8 local_2a90;
  undefined8 local_2a88;
  char *local_2a80;
  ebml_semantic *local_2a78;
  ebml_semantic *local_2a70;
  undefined4 local_2a68;
  undefined4 local_2a64;
  undefined8 local_2a60;
  undefined8 local_2a58;
  char *local_2a50;
  undefined8 local_2a48;
  ebml_semantic *local_2a40;
  undefined4 local_2a38;
  undefined4 local_2a34;
  undefined8 local_2a30;
  undefined8 local_2a28;
  char *local_2a20;
  undefined8 local_2a18;
  ebml_semantic *local_2a10;
  undefined4 local_2a08;
  undefined4 local_2a04;
  undefined8 local_2a00;
  undefined8 local_29f8;
  char *local_29f0;
  undefined8 local_29e8;
  ebml_semantic *local_29e0;
  undefined4 local_29d8;
  undefined4 local_29d4;
  undefined8 local_29d0;
  undefined8 local_29c8;
  char *local_29c0;
  undefined8 local_29b8;
  ebml_semantic *local_29b0;
  undefined4 local_29a8;
  undefined4 local_29a4;
  undefined8 local_29a0;
  undefined8 local_2998;
  char *local_2990;
  undefined8 local_2988;
  ebml_semantic *local_2980;
  undefined4 local_2978;
  undefined4 local_2974;
  undefined8 local_2970;
  undefined8 local_2968;
  char *local_2960;
  undefined8 local_2958;
  ebml_semantic *local_2950;
  undefined4 local_2948;
  undefined4 local_2944;
  undefined8 local_2940;
  undefined8 local_2938;
  char *local_2930;
  undefined8 local_2928;
  ebml_semantic *local_2920;
  undefined4 local_2918;
  undefined4 local_2914;
  undefined8 local_2910;
  undefined8 local_2908;
  char *local_2900;
  undefined8 local_28f8;
  ebml_semantic *local_28f0;
  undefined4 local_28e8;
  undefined4 local_28e4;
  undefined8 local_28e0;
  undefined8 local_28d8;
  char *local_28d0;
  undefined8 local_28c8;
  ebml_semantic *local_28c0;
  undefined4 local_28b8;
  undefined4 local_28b4;
  undefined8 local_28b0;
  undefined8 local_28a8;
  char *local_28a0;
  undefined8 local_2898;
  ebml_semantic *local_2890;
  undefined4 local_2888;
  undefined4 local_2884;
  undefined8 local_2880;
  undefined8 local_2878;
  char *local_2870;
  undefined8 local_2868;
  ebml_semantic *local_2860;
  undefined4 local_2858;
  undefined4 local_2854;
  undefined8 local_2850;
  undefined8 local_2848;
  char *local_2840;
  ebml_semantic *local_2838;
  ebml_semantic *local_2830;
  undefined4 local_2828;
  undefined4 local_2824;
  undefined8 local_2820;
  undefined8 local_2818;
  char *local_2810;
  undefined8 local_2808;
  ebml_semantic *local_2800;
  undefined4 local_27f8;
  undefined4 local_27f4;
  undefined8 local_27f0;
  undefined8 local_27e8;
  char *local_27e0;
  undefined8 local_27d8;
  ebml_semantic *local_27d0;
  undefined4 local_27c8;
  undefined4 local_27c4;
  undefined8 local_27c0;
  undefined8 local_27b8;
  char *local_27b0;
  undefined8 local_27a8;
  ebml_semantic *local_27a0;
  undefined4 local_2798;
  undefined4 local_2794;
  undefined8 local_2790;
  undefined8 local_2788;
  char *local_2780;
  undefined8 local_2778;
  ebml_semantic *local_2770;
  undefined4 local_2768;
  undefined4 local_2764;
  undefined8 local_2760;
  undefined8 local_2758;
  char *local_2750;
  undefined8 local_2748;
  ebml_semantic *local_2740;
  undefined4 local_2738;
  undefined4 local_2734;
  undefined8 local_2730;
  undefined8 local_2728;
  char *local_2720;
  undefined8 local_2718;
  ebml_semantic *local_2710;
  undefined4 local_2708;
  undefined4 local_2704;
  undefined8 local_2700;
  undefined8 local_26f8;
  char *local_26f0;
  ebml_semantic *local_26e8;
  ebml_semantic *local_26e0;
  undefined4 local_26d8;
  undefined4 local_26d4;
  undefined8 local_26d0;
  undefined8 local_26c8;
  char *local_26c0;
  ebml_semantic *local_26b8;
  ebml_semantic *local_26b0;
  undefined4 local_26a8;
  undefined4 local_26a4;
  undefined8 local_26a0;
  undefined8 local_2698;
  char *local_2690;
  undefined8 local_2688;
  ebml_semantic *local_2680;
  undefined4 local_2678;
  undefined4 local_2674;
  undefined8 local_2670;
  undefined8 local_2668;
  char *local_2660;
  undefined8 local_2658;
  ebml_semantic *local_2650;
  undefined4 local_2648;
  undefined4 local_2644;
  undefined8 local_2640;
  undefined8 local_2638;
  char *local_2630;
  undefined8 local_2628;
  ebml_semantic *local_2620;
  undefined4 local_2618;
  undefined4 local_2614;
  undefined8 local_2610;
  undefined8 local_2608;
  char *local_2600;
  undefined8 local_25f8;
  ebml_semantic *local_25f0;
  undefined4 local_25e8;
  undefined4 local_25e4;
  undefined8 local_25e0;
  undefined8 local_25d8;
  char *local_25d0;
  undefined8 local_25c8;
  ebml_semantic *local_25c0;
  undefined4 local_25b8;
  undefined4 local_25b4;
  undefined8 local_25b0;
  undefined8 local_25a8;
  char *local_25a0;
  undefined8 local_2598;
  ebml_semantic *local_2590;
  undefined4 local_2588;
  undefined4 local_2584;
  undefined8 local_2580;
  undefined8 local_2578;
  char *local_2570;
  undefined8 local_2568;
  ebml_semantic *local_2560;
  undefined4 local_2558;
  undefined4 local_2554;
  undefined8 local_2550;
  undefined8 local_2548;
  char *local_2540;
  undefined8 local_2538;
  ebml_semantic *local_2530;
  undefined4 local_2528;
  undefined4 local_2524;
  undefined8 local_2520;
  undefined8 local_2518;
  char *local_2510;
  ebml_semantic *local_2508;
  ebml_semantic *local_2500;
  undefined4 local_24f8;
  undefined4 local_24f4;
  undefined8 local_24f0;
  undefined8 local_24e8;
  char *local_24e0;
  ebml_semantic *local_24d8;
  ebml_semantic *local_24d0;
  undefined4 local_24c8;
  undefined4 local_24c4;
  undefined8 local_24c0;
  undefined8 local_24b8;
  char *local_24b0;
  ebml_semantic *local_24a8;
  ebml_semantic *local_24a0;
  undefined4 local_2498;
  undefined4 local_2494;
  undefined8 local_2490;
  undefined8 local_2488;
  char *local_2480;
  ebml_semantic *local_2478;
  ebml_semantic *local_2470;
  undefined4 local_2468;
  undefined4 local_2464;
  undefined8 local_2460;
  undefined8 local_2458;
  char *local_2450;
  undefined8 local_2448;
  ebml_semantic *local_2440;
  undefined4 local_2438;
  undefined4 local_2434;
  undefined8 local_2430;
  undefined8 local_2428;
  char *local_2420;
  undefined8 local_2418;
  ebml_semantic *local_2410;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined8 local_2400;
  undefined8 local_23f8;
  char *local_23f0;
  undefined8 local_23e8;
  ebml_semantic *local_23e0;
  undefined4 local_23d8;
  undefined4 local_23d4;
  undefined8 local_23d0;
  undefined8 local_23c8;
  char *local_23c0;
  undefined8 local_23b8;
  ebml_semantic *local_23b0;
  undefined4 local_23a8;
  undefined4 local_23a4;
  undefined8 local_23a0;
  undefined8 local_2398;
  char *local_2390;
  undefined8 local_2388;
  ebml_semantic *local_2380;
  undefined4 local_2378;
  undefined4 local_2374;
  undefined8 local_2370;
  undefined8 local_2368;
  char *local_2360;
  undefined8 local_2358;
  ebml_semantic *local_2350;
  undefined4 local_2348;
  undefined4 local_2344;
  undefined8 local_2340;
  undefined8 local_2338;
  char *local_2330;
  undefined8 local_2328;
  ebml_semantic *local_2320;
  undefined4 local_2318;
  undefined4 local_2314;
  undefined8 local_2310;
  undefined8 local_2308;
  char *local_2300;
  undefined8 local_22f8;
  ebml_semantic *local_22f0;
  undefined4 local_22e8;
  undefined4 local_22e4;
  undefined8 local_22e0;
  undefined8 local_22d8;
  char *local_22d0;
  undefined8 local_22c8;
  ebml_semantic *local_22c0;
  undefined4 local_22b8;
  undefined4 local_22b4;
  undefined8 local_22b0;
  undefined8 local_22a8;
  char *local_22a0;
  undefined8 local_2298;
  ebml_semantic *local_2290;
  undefined4 local_2288;
  undefined4 local_2284;
  undefined8 local_2280;
  undefined8 local_2278;
  char *local_2270;
  undefined8 local_2268;
  ebml_semantic *local_2260;
  undefined4 local_2258;
  undefined4 local_2254;
  undefined8 local_2250;
  undefined8 local_2248;
  char *local_2240;
  ebml_semantic *local_2238;
  ebml_semantic *local_2230;
  undefined4 local_2228;
  undefined4 local_2224;
  undefined8 local_2220;
  undefined8 local_2218;
  char *local_2210;
  ebml_semantic *local_2208;
  ebml_semantic *local_2200;
  undefined4 local_21f8;
  undefined4 local_21f4;
  undefined8 local_21f0;
  undefined8 local_21e8;
  char *local_21e0;
  ebml_semantic *local_21d8;
  ebml_semantic *local_21d0;
  undefined4 local_21c8;
  undefined4 local_21c4;
  undefined8 local_21c0;
  undefined8 local_21b8;
  char *local_21b0;
  ebml_semantic *local_21a8;
  ebml_semantic *local_21a0;
  undefined4 local_2198;
  undefined4 local_2194;
  undefined8 local_2190;
  undefined8 local_2188;
  char *local_2180;
  ebml_semantic *local_2178;
  ebml_semantic *local_2170;
  undefined4 local_2168;
  undefined4 local_2164;
  undefined8 local_2160;
  undefined8 local_2158;
  char *local_2150;
  undefined8 local_2148;
  ebml_semantic *local_2140;
  undefined4 local_2138;
  undefined4 local_2134;
  undefined8 local_2130;
  undefined8 local_2128;
  char *local_2120;
  undefined8 local_2118;
  ebml_semantic *local_2110;
  undefined4 local_2108;
  undefined4 local_2104;
  undefined8 local_2100;
  undefined8 local_20f8;
  char *local_20f0;
  undefined8 local_20e8;
  ebml_semantic *local_20e0;
  undefined4 local_20d8;
  undefined4 local_20d4;
  undefined8 local_20d0;
  undefined8 local_20c8;
  char *local_20c0;
  undefined8 local_20b8;
  ebml_semantic *local_20b0;
  undefined4 local_20a8;
  undefined4 local_20a4;
  undefined8 local_20a0;
  undefined8 local_2098;
  char *local_2090;
  ebml_semantic *local_2088;
  ebml_semantic *local_2080;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined8 local_2070;
  undefined8 local_2068;
  char *local_2060;
  undefined8 local_2058;
  ebml_semantic *local_2050;
  undefined4 local_2048;
  undefined4 local_2044;
  undefined8 local_2040;
  undefined8 local_2038;
  char *local_2030;
  undefined8 local_2028;
  ebml_semantic *local_2020;
  undefined4 local_2018;
  undefined4 local_2014;
  undefined8 local_2010;
  undefined8 local_2008;
  char *local_2000;
  undefined8 local_1ff8;
  ebml_semantic *local_1ff0;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined8 local_1fe0;
  undefined8 local_1fd8;
  char *local_1fd0;
  ebml_semantic *local_1fc8;
  ebml_semantic *local_1fc0;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined8 local_1fb0;
  undefined8 local_1fa8;
  char *local_1fa0;
  undefined8 local_1f98;
  ebml_semantic *local_1f90;
  undefined4 local_1f88;
  undefined4 local_1f84;
  undefined8 local_1f80;
  undefined8 local_1f78;
  char *local_1f70;
  undefined8 local_1f68;
  ebml_semantic *local_1f60;
  undefined4 local_1f58;
  undefined4 local_1f54;
  undefined8 local_1f50;
  undefined8 local_1f48;
  char *local_1f40;
  undefined8 local_1f38;
  ebml_semantic *local_1f30;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined8 local_1f20;
  undefined8 local_1f18;
  char *local_1f10;
  undefined8 local_1f08;
  ebml_semantic *local_1f00;
  undefined4 local_1ef8;
  undefined4 local_1ef4;
  undefined8 local_1ef0;
  undefined8 local_1ee8;
  char *local_1ee0;
  undefined8 local_1ed8;
  ebml_semantic *local_1ed0;
  undefined4 local_1ec8;
  undefined4 local_1ec4;
  undefined8 local_1ec0;
  undefined8 local_1eb8;
  char *local_1eb0;
  undefined8 local_1ea8;
  ebml_semantic *local_1ea0;
  undefined4 local_1e98;
  undefined4 local_1e94;
  undefined8 local_1e90;
  undefined8 local_1e88;
  char *local_1e80;
  undefined8 local_1e78;
  ebml_semantic *local_1e70;
  undefined4 local_1e68;
  undefined4 local_1e64;
  undefined8 local_1e60;
  undefined8 local_1e58;
  char *local_1e50;
  undefined8 local_1e48;
  ebml_semantic *local_1e40;
  undefined4 local_1e38;
  undefined4 local_1e34;
  undefined8 local_1e30;
  undefined8 local_1e28;
  char *local_1e20;
  undefined8 local_1e18;
  ebml_semantic *local_1e10;
  undefined4 local_1e08;
  undefined4 local_1e04;
  undefined8 local_1e00;
  undefined8 local_1df8;
  char *local_1df0;
  undefined8 local_1de8;
  ebml_semantic *local_1de0;
  undefined4 local_1dd8;
  undefined4 local_1dd4;
  undefined8 local_1dd0;
  undefined8 local_1dc8;
  char *local_1dc0;
  ebml_semantic *local_1db8;
  ebml_semantic *local_1db0;
  undefined4 local_1da8;
  undefined4 local_1da4;
  undefined8 local_1da0;
  undefined8 local_1d98;
  char *local_1d90;
  ebml_semantic *local_1d88;
  ebml_semantic *local_1d80;
  undefined4 local_1d78;
  undefined4 local_1d74;
  undefined8 local_1d70;
  undefined8 local_1d68;
  char *local_1d60;
  undefined8 local_1d58;
  ebml_semantic *local_1d50;
  undefined4 local_1d48;
  undefined4 local_1d44;
  undefined8 local_1d40;
  undefined8 local_1d38;
  char *local_1d30;
  ebml_semantic *local_1d28;
  ebml_semantic *local_1d20;
  undefined4 local_1d18;
  undefined4 local_1d14;
  undefined8 local_1d10;
  undefined8 local_1d08;
  char *local_1d00;
  ebml_semantic *local_1cf8;
  ebml_semantic *local_1cf0;
  undefined4 local_1ce8;
  undefined4 local_1ce4;
  undefined8 local_1ce0;
  undefined8 local_1cd8;
  char *local_1cd0;
  undefined8 local_1cc8;
  ebml_semantic *local_1cc0;
  undefined4 local_1cb8;
  undefined4 local_1cb4;
  undefined8 local_1cb0;
  undefined8 local_1ca8;
  char *local_1ca0;
  undefined8 local_1c98;
  ebml_semantic *local_1c90;
  undefined4 local_1c88;
  undefined4 local_1c84;
  undefined8 local_1c80;
  undefined8 local_1c78;
  char *local_1c70;
  ebml_semantic *local_1c68;
  ebml_semantic *local_1c60;
  undefined4 local_1c58;
  undefined4 local_1c54;
  undefined8 local_1c50;
  undefined8 local_1c48;
  char *local_1c40;
  undefined8 local_1c38;
  ebml_semantic *local_1c30;
  undefined4 local_1c28;
  undefined4 local_1c24;
  undefined8 local_1c20;
  undefined8 local_1c18;
  char *local_1c10;
  undefined8 local_1c08;
  ebml_semantic *local_1c00;
  undefined4 local_1bf8;
  undefined4 local_1bf4;
  undefined8 local_1bf0;
  undefined8 local_1be8;
  char *local_1be0;
  undefined8 local_1bd8;
  ebml_semantic *local_1bd0;
  undefined4 local_1bc8;
  undefined4 local_1bc4;
  undefined8 local_1bc0;
  undefined8 local_1bb8;
  char *local_1bb0;
  undefined8 local_1ba8;
  ebml_semantic *local_1ba0;
  undefined4 local_1b98;
  undefined4 local_1b94;
  undefined8 local_1b90;
  undefined8 local_1b88;
  char *local_1b80;
  undefined8 local_1b78;
  ebml_semantic *local_1b70;
  undefined4 local_1b68;
  undefined4 local_1b64;
  undefined8 local_1b60;
  undefined8 local_1b58;
  char *local_1b50;
  undefined8 local_1b48;
  ebml_semantic *local_1b40;
  undefined4 local_1b38;
  undefined4 local_1b34;
  undefined8 local_1b30;
  undefined8 local_1b28;
  char *local_1b20;
  ebml_semantic *local_1b18;
  ebml_semantic *local_1b10;
  undefined4 local_1b08;
  undefined4 local_1b04;
  undefined8 local_1b00;
  undefined8 local_1af8;
  char *local_1af0;
  ebml_semantic *local_1ae8;
  ebml_semantic *local_1ae0;
  undefined4 local_1ad8;
  undefined4 local_1ad4;
  undefined8 local_1ad0;
  undefined8 local_1ac8;
  char *local_1ac0;
  undefined8 local_1ab8;
  ebml_semantic *local_1ab0;
  undefined4 local_1aa8;
  undefined4 local_1aa4;
  undefined8 local_1aa0;
  undefined8 local_1a98;
  char *local_1a90;
  undefined8 local_1a88;
  ebml_semantic *local_1a80;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined8 local_1a70;
  undefined8 local_1a68;
  char *local_1a60;
  undefined8 local_1a58;
  ebml_semantic *local_1a50;
  undefined4 local_1a48;
  undefined4 local_1a44;
  undefined8 local_1a40;
  undefined8 local_1a38;
  char *local_1a30;
  undefined8 local_1a28;
  ebml_semantic *local_1a20;
  undefined4 local_1a18;
  undefined4 local_1a14;
  undefined8 local_1a10;
  undefined8 local_1a08;
  char *local_1a00;
  undefined8 local_19f8;
  ebml_semantic *local_19f0;
  undefined4 local_19e8;
  undefined4 local_19e4;
  undefined8 local_19e0;
  undefined8 local_19d8;
  char *local_19d0;
  ebml_semantic *local_19c8;
  ebml_semantic *local_19c0;
  undefined4 local_19b8;
  undefined4 local_19b4;
  undefined8 local_19b0;
  undefined8 local_19a8;
  char *local_19a0;
  ebml_semantic *local_1998;
  ebml_semantic *local_1990;
  undefined4 local_1988;
  undefined4 local_1984;
  undefined8 local_1980;
  undefined8 local_1978;
  char *local_1970;
  undefined8 local_1968;
  ebml_semantic *local_1960;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined8 local_1950;
  undefined8 local_1948;
  char *local_1940;
  undefined8 local_1938;
  ebml_semantic *local_1930;
  undefined4 local_1928;
  undefined4 local_1924;
  undefined8 local_1920;
  undefined8 local_1918;
  char *local_1910;
  undefined8 local_1908;
  ebml_semantic *local_1900;
  undefined4 local_18f8;
  undefined4 local_18f4;
  undefined8 local_18f0;
  undefined8 local_18e8;
  char *local_18e0;
  undefined8 local_18d8;
  ebml_semantic *local_18d0;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined8 local_18c0;
  undefined8 local_18b8;
  char *local_18b0;
  undefined8 local_18a8;
  ebml_semantic *local_18a0;
  undefined4 local_1898;
  undefined4 local_1894;
  undefined8 local_1890;
  undefined8 local_1888;
  char *local_1880;
  undefined8 local_1878;
  ebml_semantic *local_1870;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined8 local_1860;
  undefined8 local_1858;
  char *local_1850;
  undefined8 local_1848;
  ebml_semantic *local_1840;
  undefined4 local_1838;
  undefined4 local_1834;
  undefined8 local_1830;
  undefined8 local_1828;
  char *local_1820;
  undefined8 local_1818;
  ebml_semantic *local_1810;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined8 local_1800;
  undefined8 local_17f8;
  char *local_17f0;
  undefined8 local_17e8;
  ebml_semantic *local_17e0;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined8 local_17d0;
  undefined8 local_17c8;
  char *local_17c0;
  undefined8 local_17b8;
  ebml_semantic *local_17b0;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined8 local_17a0;
  undefined8 local_1798;
  char *local_1790;
  undefined8 local_1788;
  ebml_semantic *local_1780;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined8 local_1770;
  undefined8 local_1768;
  char *local_1760;
  undefined8 local_1758;
  ebml_semantic *local_1750;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined8 local_1740;
  undefined8 local_1738;
  char *local_1730;
  undefined8 local_1728;
  ebml_semantic *local_1720;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined8 local_1710;
  undefined8 local_1708;
  char *local_1700;
  undefined8 local_16f8;
  ebml_semantic *local_16f0;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined8 local_16e0;
  undefined8 local_16d8;
  char *local_16d0;
  undefined8 local_16c8;
  ebml_semantic *local_16c0;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined8 local_16b0;
  undefined8 local_16a8;
  char *local_16a0;
  undefined8 local_1698;
  ebml_semantic *local_1690;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined8 local_1680;
  undefined8 local_1678;
  char *local_1670;
  undefined8 local_1668;
  ebml_semantic *local_1660;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined8 local_1650;
  undefined8 local_1648;
  char *local_1640;
  undefined8 local_1638;
  ebml_semantic *local_1630;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined8 local_1620;
  undefined8 local_1618;
  char *local_1610;
  undefined8 local_1608;
  ebml_semantic *local_1600;
  undefined4 local_15f8;
  undefined4 local_15f4;
  undefined8 local_15f0;
  undefined8 local_15e8;
  char *local_15e0;
  undefined8 local_15d8;
  ebml_semantic *local_15d0;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined8 local_15c0;
  undefined8 local_15b8;
  char *local_15b0;
  undefined8 local_15a8;
  ebml_semantic *local_15a0;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined8 local_1590;
  undefined8 local_1588;
  char *local_1580;
  undefined8 local_1578;
  ebml_semantic *local_1570;
  undefined4 local_1568;
  undefined4 local_1564;
  undefined8 local_1560;
  undefined8 local_1558;
  char *local_1550;
  undefined8 local_1548;
  ebml_semantic *local_1540;
  undefined4 local_1538;
  undefined4 local_1534;
  undefined8 local_1530;
  undefined8 local_1528;
  char *local_1520;
  undefined8 local_1518;
  ebml_semantic *local_1510;
  undefined4 local_1508;
  undefined4 local_1504;
  undefined8 local_1500;
  undefined8 local_14f8;
  char *local_14f0;
  undefined8 local_14e8;
  ebml_semantic *local_14e0;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined8 local_14d0;
  undefined8 local_14c8;
  char *local_14c0;
  undefined8 local_14b8;
  ebml_semantic *local_14b0;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 local_1498;
  char *local_1490;
  undefined8 local_1488;
  ebml_semantic *local_1480;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined8 local_1470;
  undefined8 local_1468;
  char *local_1460;
  undefined8 local_1458;
  ebml_semantic *local_1450;
  undefined4 local_1448;
  undefined4 local_1444;
  undefined8 local_1440;
  undefined8 local_1438;
  char *local_1430;
  undefined8 local_1428;
  ebml_semantic *local_1420;
  undefined4 local_1418;
  undefined4 local_1414;
  undefined8 local_1410;
  undefined8 local_1408;
  char *local_1400;
  undefined8 local_13f8;
  ebml_semantic *local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined8 local_13e0;
  undefined8 local_13d8;
  char *local_13d0;
  undefined8 local_13c8;
  ebml_semantic *local_13c0;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined8 local_13b0;
  undefined8 local_13a8;
  char *local_13a0;
  undefined8 local_1398;
  ebml_semantic *local_1390;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined8 local_1380;
  undefined8 local_1378;
  char *local_1370;
  undefined8 local_1368;
  ebml_semantic *local_1360;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined8 local_1350;
  undefined8 local_1348;
  char *local_1340;
  undefined8 local_1338;
  ebml_semantic *local_1330;
  undefined4 local_1328;
  undefined4 local_1324;
  undefined8 local_1320;
  undefined8 local_1318;
  char *local_1310;
  undefined8 local_1308;
  ebml_semantic *local_1300;
  undefined4 local_12f8;
  undefined4 local_12f4;
  undefined8 local_12f0;
  undefined8 local_12e8;
  char *local_12e0;
  undefined8 local_12d8;
  ebml_semantic *local_12d0;
  undefined4 local_12c8;
  undefined4 local_12c4;
  undefined8 local_12c0;
  undefined8 local_12b8;
  char *local_12b0;
  undefined8 local_12a8;
  ebml_semantic *local_12a0;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined8 local_1290;
  undefined8 local_1288;
  char *local_1280;
  undefined8 local_1278;
  ebml_semantic *local_1270;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined8 local_1260;
  undefined8 local_1258;
  char *local_1250;
  undefined8 local_1248;
  ebml_semantic *local_1240;
  undefined4 local_1238;
  undefined4 local_1234;
  undefined8 local_1230;
  undefined8 local_1228;
  char *local_1220;
  undefined8 local_1218;
  ebml_semantic *local_1210;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined8 local_1200;
  undefined8 local_11f8;
  char *local_11f0;
  undefined8 local_11e8;
  ebml_semantic *local_11e0;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined8 local_11d0;
  undefined8 local_11c8;
  char *local_11c0;
  ebml_semantic *local_11b8;
  ebml_semantic *local_11b0;
  undefined4 local_11a8;
  undefined4 local_11a4;
  undefined8 local_11a0;
  undefined8 local_1198;
  char *local_1190;
  undefined8 local_1188;
  ebml_semantic *local_1180;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined8 local_1170;
  undefined8 local_1168;
  char *local_1160;
  undefined8 local_1158;
  ebml_semantic *local_1150;
  undefined4 local_1148;
  undefined4 local_1144;
  undefined8 local_1140;
  undefined8 local_1138;
  char *local_1130;
  undefined8 local_1128;
  ebml_semantic *local_1120;
  undefined4 local_1118;
  undefined4 local_1114;
  undefined8 local_1110;
  undefined8 local_1108;
  char *local_1100;
  undefined8 local_10f8;
  ebml_semantic *local_10f0;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined8 local_10e0;
  undefined8 local_10d8;
  char *local_10d0;
  undefined8 local_10c8;
  ebml_semantic *local_10c0;
  undefined4 local_10b8;
  undefined4 local_10b4;
  undefined8 local_10b0;
  undefined8 local_10a8;
  char *local_10a0;
  undefined8 local_1098;
  ebml_semantic *local_1090;
  undefined4 local_1088;
  undefined4 local_1084;
  undefined8 local_1080;
  undefined8 local_1078;
  char *local_1070;
  undefined8 local_1068;
  ebml_semantic *local_1060;
  undefined4 local_1058;
  undefined4 local_1054;
  undefined8 local_1050;
  undefined8 local_1048;
  char *local_1040;
  undefined8 local_1038;
  ebml_semantic *local_1030;
  undefined4 local_1028;
  undefined4 local_1024;
  undefined8 local_1020;
  undefined8 local_1018;
  char *local_1010;
  undefined8 local_1008;
  ebml_semantic *local_1000;
  undefined4 local_ff8;
  undefined4 local_ff4;
  undefined8 local_ff0;
  undefined8 local_fe8;
  char *local_fe0;
  undefined8 local_fd8;
  ebml_semantic *local_fd0;
  undefined4 local_fc8;
  undefined4 local_fc4;
  undefined8 local_fc0;
  undefined8 local_fb8;
  char *local_fb0;
  undefined8 local_fa8;
  ebml_semantic *local_fa0;
  undefined4 local_f98;
  undefined4 local_f94;
  undefined8 local_f90;
  undefined8 local_f88;
  char *local_f80;
  undefined8 local_f78;
  ebml_semantic *local_f70;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined8 local_f60;
  undefined8 local_f58;
  char *local_f50;
  undefined8 local_f48;
  ebml_semantic *local_f40;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined8 local_f30;
  undefined8 local_f28;
  char *local_f20;
  undefined8 local_f18;
  ebml_semantic *local_f10;
  undefined4 local_f08;
  undefined4 local_f04;
  undefined8 local_f00;
  undefined8 local_ef8;
  char *local_ef0;
  undefined8 local_ee8;
  ebml_semantic *local_ee0;
  undefined4 local_ed8;
  undefined4 local_ed4;
  undefined8 local_ed0;
  char *local_ec8;
  char *local_ec0;
  undefined8 local_eb8;
  ebml_semantic *local_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined8 local_ea0;
  undefined8 local_e98;
  char *local_e90;
  undefined8 local_e88;
  ebml_semantic *local_e80;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined8 local_e70;
  undefined8 local_e68;
  char *local_e60;
  ebml_semantic *local_e58;
  ebml_semantic *local_e50;
  undefined4 local_e48;
  undefined4 local_e44;
  undefined8 local_e40;
  undefined8 local_e38;
  char *local_e30;
  undefined8 local_e28;
  ebml_semantic *local_e20;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined8 local_e10;
  undefined8 local_e08;
  char *local_e00;
  undefined8 local_df8;
  ebml_semantic *local_df0;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined8 local_de0;
  undefined8 local_dd8;
  char *local_dd0;
  undefined8 local_dc8;
  ebml_semantic *local_dc0;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined8 local_db0;
  undefined8 local_da8;
  char *local_da0;
  undefined8 local_d98;
  ebml_semantic *local_d90;
  undefined4 local_d88;
  undefined4 local_d84;
  undefined8 local_d80;
  undefined8 local_d78;
  char *local_d70;
  undefined8 local_d68;
  ebml_semantic *local_d60;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined8 local_d50;
  undefined8 local_d48;
  char *local_d40;
  undefined8 local_d38;
  ebml_semantic *local_d30;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined8 local_d20;
  undefined8 local_d18;
  char *local_d10;
  undefined8 local_d08;
  ebml_semantic *local_d00;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined8 local_cf0;
  undefined8 local_ce8;
  char *local_ce0;
  undefined8 local_cd8;
  ebml_semantic *local_cd0;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined8 local_cc0;
  undefined8 local_cb8;
  char *local_cb0;
  undefined8 local_ca8;
  ebml_semantic *local_ca0;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined8 local_c90;
  undefined8 local_c88;
  char *local_c80;
  undefined8 local_c78;
  ebml_semantic *local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined8 local_c60;
  undefined8 local_c58;
  char *local_c50;
  undefined8 local_c48;
  ebml_semantic *local_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined8 local_c30;
  undefined8 local_c28;
  char *local_c20;
  undefined8 local_c18;
  ebml_semantic *local_c10;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 local_bf8;
  char *local_bf0;
  undefined8 local_be8;
  ebml_semantic *local_be0;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined8 local_bd0;
  undefined8 local_bc8;
  char *local_bc0;
  undefined8 local_bb8;
  ebml_semantic *local_bb0;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 local_b98;
  char *local_b90;
  undefined8 local_b88;
  ebml_semantic *local_b80;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined8 local_b70;
  undefined8 local_b68;
  char *local_b60;
  undefined8 local_b58;
  ebml_semantic *local_b50;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined8 local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined8 local_b28;
  ebml_semantic *local_b20;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined8 local_b10;
  undefined8 local_b08;
  char *local_b00;
  undefined8 local_af8;
  ebml_semantic *local_af0;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined8 local_ae0;
  undefined8 local_ad8;
  char *local_ad0;
  undefined8 local_ac8;
  ebml_semantic *local_ac0;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined8 local_ab0;
  undefined8 local_aa8;
  char *local_aa0;
  undefined8 local_a98;
  ebml_semantic *local_a90;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 local_a78;
  char *local_a70;
  undefined8 local_a68;
  ebml_semantic *local_a60;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined8 local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined8 local_a38;
  ebml_semantic *local_a30;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined8 local_a20;
  undefined8 local_a18;
  char *local_a10;
  undefined8 local_a08;
  ebml_semantic *local_a00;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined8 local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  ebml_semantic *local_9d8;
  ebml_semantic *local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined8 local_9c0;
  undefined8 local_9b8;
  char *local_9b0;
  undefined8 local_9a8;
  ebml_semantic *local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined8 local_990;
  undefined8 local_988;
  char *local_980;
  ebml_semantic *local_978;
  ebml_semantic *local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined8 local_960;
  undefined8 local_958;
  char *local_950;
  ebml_semantic *local_948;
  ebml_semantic *local_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined8 local_930;
  undefined8 local_928;
  char *local_920;
  undefined8 local_918;
  ebml_semantic *local_910;
  undefined4 local_908;
  undefined4 local_904;
  undefined8 local_900;
  undefined8 local_8f8;
  char *local_8f0;
  undefined8 local_8e8;
  ebml_semantic *local_8e0;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined8 local_8d0;
  undefined8 local_8c8;
  char *local_8c0;
  ebml_semantic *local_8b8;
  ebml_semantic *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 local_898;
  char *local_890;
  ebml_semantic *local_888;
  ebml_semantic *local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined8 local_870;
  undefined8 local_868;
  char *local_860;
  undefined8 local_858;
  ebml_semantic *local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined8 local_840;
  undefined8 local_838;
  char *local_830;
  undefined8 local_828;
  ebml_semantic *local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined8 local_810;
  undefined8 local_808;
  char *local_800;
  undefined8 local_7f8;
  ebml_semantic *local_7f0;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined8 local_7e0;
  undefined8 local_7d8;
  char *local_7d0;
  undefined8 local_7c8;
  ebml_semantic *local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined8 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined8 local_798;
  ebml_semantic *local_790;
  undefined4 local_788;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 local_778;
  char *local_770;
  undefined8 local_768;
  ebml_semantic *local_760;
  undefined4 local_758;
  undefined4 local_754;
  undefined8 local_750;
  undefined8 local_748;
  char *local_740;
  undefined8 local_738;
  ebml_semantic *local_730;
  undefined4 local_728;
  undefined4 local_724;
  undefined8 local_720;
  undefined8 local_718;
  char *local_710;
  undefined8 local_708;
  ebml_semantic *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined8 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined8 local_6d8;
  ebml_semantic *local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined8 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined8 local_6a8;
  ebml_semantic *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined8 local_690;
  undefined8 local_688;
  char *local_680;
  undefined8 local_678;
  ebml_semantic *local_670;
  undefined4 local_668;
  undefined4 local_664;
  undefined8 local_660;
  undefined8 local_658;
  char *local_650;
  ebml_semantic *local_648;
  ebml_semantic *local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined8 local_630;
  undefined8 local_628;
  char *local_620;
  ebml_semantic *local_618;
  ebml_semantic *local_610;
  undefined4 local_608;
  undefined4 local_604;
  undefined8 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined8 local_5e8;
  ebml_semantic *local_5e0;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined8 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined8 local_5b8;
  ebml_semantic *local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined8 local_588;
  ebml_semantic *local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined8 local_570;
  undefined8 local_568;
  char *local_560;
  undefined8 local_558;
  ebml_semantic *local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 local_538;
  char *local_530;
  undefined8 local_528;
  ebml_semantic *local_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined8 local_510;
  undefined8 local_508;
  char *local_500;
  undefined8 local_4f8;
  ebml_semantic *local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined8 local_4c8;
  ebml_semantic *local_4c0;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined8 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  ebml_semantic *local_498;
  ebml_semantic *local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined8 local_480;
  undefined8 local_478;
  char *local_470;
  undefined8 local_468;
  ebml_semantic *local_460;
  undefined4 local_458;
  undefined4 local_454;
  undefined8 local_450;
  undefined8 local_448;
  char *local_440;
  undefined8 local_438;
  ebml_semantic *local_430;
  undefined4 local_428;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 local_418;
  char *local_410;
  ebml_semantic *local_408;
  ebml_semantic *local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined8 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined8 local_3d8;
  ebml_semantic *local_3d0;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  ebml_semantic *local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined8 local_390;
  undefined8 local_388;
  char *local_380;
  undefined8 local_378;
  ebml_semantic *local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined8 local_360;
  undefined8 local_358;
  char *local_350;
  undefined8 local_348;
  ebml_semantic *local_340;
  undefined4 local_338;
  undefined4 local_334;
  undefined8 local_330;
  undefined8 local_328;
  char *local_320;
  undefined8 local_318;
  ebml_semantic *local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined8 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined8 local_2e8;
  ebml_semantic *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined8 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  ebml_semantic *local_2b8;
  ebml_semantic *local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined8 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined8 local_288;
  ebml_semantic *local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined8 local_270;
  undefined8 local_268;
  char *local_260;
  undefined8 local_258;
  ebml_semantic *local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined8 local_240;
  undefined8 local_238;
  char *local_230;
  undefined8 local_228;
  ebml_semantic *local_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined8 local_210;
  undefined8 local_208;
  char *local_200;
  undefined8 local_1f8;
  ebml_semantic *local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  ebml_semantic *local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  ebml_semantic *local_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined8 local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168;
  ebml_semantic *local_160;
  undefined4 local_158;
  undefined4 local_154;
  undefined8 local_150;
  undefined8 local_148;
  char *local_140;
  undefined8 local_138;
  ebml_semantic *local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 local_118;
  char *local_110;
  undefined8 local_108;
  ebml_semantic *local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined8 local_d8;
  ebml_semantic *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  char *local_b0;
  ebml_semantic *local_a8;
  ebml_semantic *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  ebml_semantic *local_78;
  ebml_semantic *local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  ebml_semantic *local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  ebml_semantic *local_10;
  
  local_38 = 0x53ab;
  local_34 = 0x4e494245;
  local_30 = 0;
  local_28 = 0;
  local_20 = "SeekID";
  local_18 = 0;
  local_10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSeekID,&local_38,0x30);
  local_68 = 0x53ac;
  local_64 = 0x54494245;
  local_60 = 0;
  local_58 = 0;
  local_50 = "SeekPosition";
  local_48 = 0;
  local_40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSeekPosition,&local_68,0x30);
  local_98 = 0x4dbb;
  local_94 = 0x4b534b4d;
  local_90 = 0;
  local_88 = 0;
  local_80 = "Seek";
  local_78 = EBML_SemanticSeek;
  local_70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSeek,&local_98,0x30);
  local_c8 = 0x114d9b74;
  local_c4 = 0x544d4245;
  local_c0 = 0;
  local_b8 = 0;
  local_b0 = "SeekHead";
  local_a8 = EBML_SemanticSeekHead;
  local_a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSeekHead,&local_c8,0x30);
  local_f8 = 0x73a4;
  local_f4 = 0x44494b4d;
  local_f0 = 0;
  local_e8 = 0;
  local_e0 = "SegmentUUID";
  local_d8 = 0;
  local_d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSegmentUUID,&local_f8,0x30);
  local_128 = 0x7384;
  local_124 = 0x55534245;
  local_120 = 0;
  local_118 = 0;
  local_110 = "SegmentFilename";
  local_108 = 0;
  local_100 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSegmentFilename,&local_128,0x30);
  local_158 = 0x3cb923;
  local_154 = 0x44494b4d;
  local_150 = 0;
  local_148 = 0;
  local_140 = "PrevUUID";
  local_138 = 0;
  local_130 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrevUUID,&local_158,0x30);
  local_188 = 0x3c83ab;
  local_184 = 0x55534245;
  local_180 = 0;
  local_178 = 0;
  local_170 = "PrevFilename";
  local_168 = 0;
  local_160 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrevFilename,&local_188,0x30);
  local_1b8 = 0x3eb923;
  local_1b4 = 0x44494b4d;
  local_1b0 = 0;
  local_1a8 = 0;
  local_1a0 = "NextUUID";
  local_198 = 0;
  local_190 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextNextUUID,&local_1b8,0x30);
  local_1e8 = 0x3e83bb;
  local_1e4 = 0x55534245;
  local_1e0 = 0;
  local_1d8 = 0;
  local_1d0 = "NextFilename";
  local_1c8 = 0;
  local_1c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextNextFilename,&local_1e8,0x30);
  local_218 = 0x4444;
  local_214 = 0x44494b4d;
  local_210 = 0;
  local_208 = 0;
  local_200 = "SegmentFamily";
  local_1f8 = 0;
  local_1f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSegmentFamily,&local_218,0x30);
  local_248 = 0x69a5;
  local_244 = 0x4e494245;
  local_240 = 0;
  local_238 = 0;
  local_230 = "ChapterTranslateID";
  local_228 = 0;
  local_220 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTranslateID,&local_248,0x30);
  local_278 = 0x69bf;
  local_274 = 0x54494245;
  local_270 = 0;
  local_268 = 0;
  local_260 = "ChapterTranslateCodec";
  local_258 = 0;
  local_250 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTranslateCodec,&local_278,0x30);
  local_2a8 = 0x69fc;
  local_2a4 = 0x54494245;
  local_2a0 = 0;
  local_298 = 0;
  local_290 = "ChapterTranslateEditionUID";
  local_288 = 0;
  local_280 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTranslateEditionUID,&local_2a8,0x30);
  local_2d8 = 0x6924;
  local_2d4 = 0x544d4245;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = "ChapterTranslate";
  local_2b8 = EBML_SemanticChapterTranslate;
  local_2b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTranslate,&local_2d8,0x30);
  local_308 = 0x2ad7b1;
  local_304 = 0x54494245;
  local_300 = 1;
  local_2f8 = 1000000;
  local_2f0 = "TimestampScale";
  local_2e8 = 0;
  local_2e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTimestampScale,&local_308,0x30);
  local_338 = 0x4489;
  local_334 = 0x4c464245;
  local_330 = 0;
  local_328 = 0;
  local_320 = "Duration";
  local_318 = 0;
  local_310 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDuration,&local_338,0x30);
  local_368 = 0x4461;
  local_364 = 0x54444245;
  local_360 = 0;
  local_358 = 0;
  local_350 = "DateUTC";
  local_348 = 0;
  local_340 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDateUTC,&local_368,0x30);
  local_398 = 0x7ba9;
  local_394 = 0x55534245;
  local_390 = 0;
  local_388 = 0;
  local_380 = "Title";
  local_378 = 0;
  local_370 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTitle,&local_398,0x30);
  local_3c8 = 0x4d80;
  local_3c4 = 0x55534245;
  local_3c0 = 0;
  local_3b8 = 0;
  local_3b0 = "MuxingApp";
  local_3a8 = 0;
  local_3a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMuxingApp,&local_3c8,0x30);
  local_3f8 = 0x5741;
  local_3f4 = 0x55534245;
  local_3f0 = 0;
  local_3e8 = 0;
  local_3e0 = "WritingApp";
  local_3d8 = 0;
  local_3d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextWritingApp,&local_3f8,0x30);
  local_428 = 0x1549a966;
  local_424 = 0x544d4245;
  local_420 = 0;
  local_418 = 0;
  local_410 = "Info";
  local_408 = EBML_SemanticInfo;
  local_400 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextInfo,&local_428,0x30);
  local_458 = 0xe7;
  local_454 = 0x54494245;
  local_450 = 0;
  local_448 = 0;
  local_440 = "Timestamp";
  local_438 = 0;
  local_430 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTimestamp,&local_458,0x30);
  local_488 = 0x58d7;
  local_484 = 0x54494245;
  local_480 = 0;
  local_478 = 0;
  local_470 = "SilentTrackNumber";
  local_468 = 0;
  local_460 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSilentTrackNumber,&local_488,0x30);
  local_4b8 = 0x5854;
  local_4b4 = 0x544d4245;
  local_4b0 = 0;
  local_4a8 = 0;
  local_4a0 = "SilentTracks";
  local_498 = EBML_SemanticSilentTracks;
  local_490 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSilentTracks,&local_4b8,0x30);
  local_4e8 = 0xa7;
  local_4e4 = 0x54494245;
  local_4e0 = 0;
  local_4d8 = 0;
  local_4d0 = "Position";
  local_4c8 = 0;
  local_4c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPosition,&local_4e8,0x30);
  local_518 = 0xab;
  local_514 = 0x54494245;
  local_510 = 0;
  local_508 = 0;
  local_500 = "PrevSize";
  local_4f8 = 0;
  local_4f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrevSize,&local_518,0x30);
  local_548 = 0xa3;
  local_544 = 0x4c424b4d;
  local_540 = 0;
  local_538 = 0;
  local_530 = "SimpleBlock";
  local_528 = 0;
  local_520 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSimpleBlock,&local_548,0x30);
  local_578 = 0xa1;
  local_574 = 0x4c424b4d;
  local_570 = 0;
  local_568 = 0;
  local_560 = "Block";
  local_558 = 0;
  local_550 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlock,&local_578,0x30);
  local_5a8 = 0xa2;
  local_5a4 = 0x4e494245;
  local_5a0 = 0;
  local_598 = 0;
  local_590 = "BlockVirtual";
  local_588 = 0;
  local_580 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockVirtual,&local_5a8,0x30);
  local_5d8 = 0xa5;
  local_5d4 = 0x4e494245;
  local_5d0 = 0;
  local_5c8 = 0;
  local_5c0 = "BlockAdditional";
  local_5b8 = 0;
  local_5b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAdditional,&local_5d8,0x30);
  local_608 = 0xee;
  local_604 = 0x54494245;
  local_600 = 1;
  local_5f8 = 1;
  local_5f0 = "BlockAddID";
  local_5e8 = 0;
  local_5e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAddID,&local_608,0x30);
  local_638 = 0xa6;
  local_634 = 0x544d4245;
  local_630 = 0;
  local_628 = 0;
  local_620 = "BlockMore";
  local_618 = EBML_SemanticBlockMore;
  local_610 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockMore,&local_638,0x30);
  local_668 = 0x75a1;
  local_664 = 0x544d4245;
  local_660 = 0;
  local_658 = 0;
  local_650 = "BlockAdditions";
  local_648 = EBML_SemanticBlockAdditions;
  local_640 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAdditions,&local_668,0x30);
  local_698 = 0x9b;
  local_694 = 0x54494245;
  local_690 = 0;
  local_688 = 0;
  local_680 = "BlockDuration";
  local_678 = 0;
  local_670 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockDuration,&local_698,0x30);
  local_6c8 = 0xfa;
  local_6c4 = 0x54494245;
  local_6c0 = 1;
  local_6b8 = 0;
  local_6b0 = "ReferencePriority";
  local_6a8 = 0;
  local_6a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferencePriority,&local_6c8,0x30);
  local_6f8 = 0xfb;
  local_6f4 = 0x49534245;
  local_6f0 = 0;
  local_6e8 = 0;
  local_6e0 = "ReferenceBlock";
  local_6d8 = 0;
  local_6d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferenceBlock,&local_6f8,0x30);
  local_728 = 0xfd;
  local_724 = 0x49534245;
  local_720 = 0;
  local_718 = 0;
  local_710 = "ReferenceVirtual";
  local_708 = 0;
  local_700 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferenceVirtual,&local_728,0x30);
  local_758 = 0xa4;
  local_754 = 0x4e494245;
  local_750 = 0;
  local_748 = 0;
  local_740 = "CodecState";
  local_738 = 0;
  local_730 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecState,&local_758,0x30);
  local_788 = 0x75a2;
  local_784 = 0x49534245;
  local_780 = 0;
  local_778 = 0;
  local_770 = "DiscardPadding";
  local_768 = 0;
  local_760 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDiscardPadding,&local_788,0x30);
  local_7b8 = 0xcc;
  local_7b4 = 0x54494245;
  local_7b0 = 0;
  local_7a8 = 0;
  local_7a0 = "LaceNumber";
  local_798 = 0;
  local_790 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextLaceNumber,&local_7b8,0x30);
  local_7e8 = 0xcd;
  local_7e4 = 0x54494245;
  local_7e0 = 1;
  local_7d8 = 0;
  local_7d0 = "FrameNumber";
  local_7c8 = 0;
  local_7c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFrameNumber,&local_7e8,0x30);
  local_818 = 0xcb;
  local_814 = 0x54494245;
  local_810 = 1;
  local_808 = 0;
  local_800 = "BlockAdditionID";
  local_7f8 = 0;
  local_7f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAdditionID,&local_818,0x30);
  local_848 = 0xce;
  local_844 = 0x54494245;
  local_840 = 1;
  local_838 = 0;
  local_830 = "Delay";
  local_828 = 0;
  local_820 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDelay,&local_848,0x30);
  local_878 = 0xcf;
  local_874 = 0x54494245;
  local_870 = 1;
  local_868 = 0;
  local_860 = "SliceDuration";
  local_858 = 0;
  local_850 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSliceDuration,&local_878,0x30);
  local_8a8 = 0xe8;
  local_8a4 = 0x544d4245;
  local_8a0 = 0;
  local_898 = 0;
  local_890 = "TimeSlice";
  local_888 = EBML_SemanticTimeSlice;
  local_880 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTimeSlice,&local_8a8,0x30);
  local_8d8 = 0x8e;
  local_8d4 = 0x544d4245;
  local_8d0 = 0;
  local_8c8 = 0;
  local_8c0 = "Slices";
  local_8b8 = EBML_SemanticSlices;
  local_8b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSlices,&local_8d8,0x30);
  local_908 = 0xc9;
  local_904 = 0x54494245;
  local_900 = 0;
  local_8f8 = 0;
  local_8f0 = "ReferenceOffset";
  local_8e8 = 0;
  local_8e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferenceOffset,&local_908,0x30);
  local_938 = 0xca;
  local_934 = 0x54494245;
  local_930 = 0;
  local_928 = 0;
  local_920 = "ReferenceTimestamp";
  local_918 = 0;
  local_910 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferenceTimestamp,&local_938,0x30);
  local_968 = 200;
  local_964 = 0x544d4245;
  local_960 = 0;
  local_958 = 0;
  local_950 = "ReferenceFrame";
  local_948 = EBML_SemanticReferenceFrame;
  local_940 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextReferenceFrame,&local_968,0x30);
  local_998 = 0xa0;
  local_994 = 0x47424b4d;
  local_990 = 0;
  local_988 = 0;
  local_980 = "BlockGroup";
  local_978 = EBML_SemanticBlockGroup;
  local_970 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockGroup,&local_998,0x30);
  local_9c8 = 0xaf;
  local_9c4 = 0x4e494245;
  local_9c0 = 0;
  local_9b8 = 0;
  local_9b0 = "EncryptedBlock";
  local_9a8 = 0;
  local_9a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEncryptedBlock,&local_9c8,0x30);
  local_9f8 = 0x1f43b675;
  local_9f4 = 0x55434b4d;
  local_9f0 = 0;
  local_9e8 = 0;
  local_9e0 = "Cluster";
  local_9d8 = EBML_SemanticCluster;
  local_9d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCluster,&local_9f8,0x30);
  local_a28 = 0xd7;
  local_a24 = 0x54494245;
  local_a20 = 0;
  local_a18 = 0;
  local_a10 = "TrackNumber";
  local_a08 = 0;
  local_a00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackNumber,&local_a28,0x30);
  local_a58 = 0x73c5;
  local_a54 = 0x54494245;
  local_a50 = 0;
  local_a48 = 0;
  local_a40 = "TrackUID";
  local_a38 = 0;
  local_a30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackUID,&local_a58,0x30);
  local_a88 = 0x83;
  local_a84 = 0x54494245;
  local_a80 = 0;
  local_a78 = 0;
  local_a70 = "TrackType";
  local_a68 = 0;
  local_a60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackType,&local_a88,0x30);
  local_ab8 = 0xb9;
  local_ab4 = 0x4f424245;
  local_ab0 = 1;
  local_aa8 = 1;
  local_aa0 = "FlagEnabled";
  local_a98 = 0;
  local_a90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagEnabled,&local_ab8,0x30);
  local_ae8 = 0x88;
  local_ae4 = 0x4f424245;
  local_ae0 = 1;
  local_ad8 = 1;
  local_ad0 = "FlagDefault";
  local_ac8 = 0;
  local_ac0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagDefault,&local_ae8,0x30);
  local_b18 = 0x55aa;
  local_b14 = 0x4f424245;
  local_b10 = 1;
  local_b08 = 0;
  local_b00 = "FlagForced";
  local_af8 = 0;
  local_af0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagForced,&local_b18,0x30);
  local_b48 = 0x55ab;
  local_b44 = 0x4f424245;
  local_b40 = 0;
  local_b38 = 0;
  local_b30 = "FlagHearingImpaired";
  local_b28 = 0;
  local_b20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagHearingImpaired,&local_b48,0x30);
  local_b78 = 0x55ac;
  local_b74 = 0x4f424245;
  local_b70 = 0;
  local_b68 = 0;
  local_b60 = "FlagVisualImpaired";
  local_b58 = 0;
  local_b50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagVisualImpaired,&local_b78,0x30);
  local_ba8 = 0x55ad;
  local_ba4 = 0x4f424245;
  local_ba0 = 0;
  local_b98 = 0;
  local_b90 = "FlagTextDescriptions";
  local_b88 = 0;
  local_b80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagTextDescriptions,&local_ba8,0x30);
  local_bd8 = 0x55ae;
  local_bd4 = 0x4f424245;
  local_bd0 = 0;
  local_bc8 = 0;
  local_bc0 = "FlagOriginal";
  local_bb8 = 0;
  local_bb0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagOriginal,&local_bd8,0x30);
  local_c08 = 0x55af;
  local_c04 = 0x4f424245;
  local_c00 = 0;
  local_bf8 = 0;
  local_bf0 = "FlagCommentary";
  local_be8 = 0;
  local_be0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagCommentary,&local_c08,0x30);
  local_c38 = 0x9c;
  local_c34 = 0x4f424245;
  local_c30 = 1;
  local_c28 = 1;
  local_c20 = "FlagLacing";
  local_c18 = 0;
  local_c10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagLacing,&local_c38,0x30);
  local_c68 = 0x6de7;
  local_c64 = 0x54494245;
  local_c60 = 1;
  local_c58 = 0;
  local_c50 = "MinCache";
  local_c48 = 0;
  local_c40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMinCache,&local_c68,0x30);
  local_c98 = 0x6df8;
  local_c94 = 0x54494245;
  local_c90 = 0;
  local_c88 = 0;
  local_c80 = "MaxCache";
  local_c78 = 0;
  local_c70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMaxCache,&local_c98,0x30);
  local_cc8 = 0x23e383;
  local_cc4 = 0x54494245;
  local_cc0 = 0;
  local_cb8 = 0;
  local_cb0 = "DefaultDuration";
  local_ca8 = 0;
  local_ca0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDefaultDuration,&local_cc8,0x30);
  local_cf8 = 0x234e7a;
  local_cf4 = 0x54494245;
  local_cf0 = 0;
  local_ce8 = 0;
  local_ce0 = "DefaultDecodedFieldDuration";
  local_cd8 = 0;
  local_cd0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDefaultDecodedFieldDuration,&local_cf8,0x30);
  local_d28 = 0x23314f;
  local_d24 = 0x4c464245;
  local_d20 = 1;
  local_d18 = 1;
  local_d10 = "TrackTimestampScale";
  local_d08 = 0;
  local_d00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackTimestampScale,&local_d28,0x30);
  local_d58 = 0x537f;
  local_d54 = 0x49534245;
  local_d50 = 1;
  local_d48 = 0;
  local_d40 = "TrackOffset";
  local_d38 = 0;
  local_d30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackOffset,&local_d58,0x30);
  local_d88 = 0x55ee;
  local_d84 = 0x54494245;
  local_d80 = 1;
  local_d78 = 0;
  local_d70 = "MaxBlockAdditionID";
  local_d68 = 0;
  local_d60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMaxBlockAdditionID,&local_d88,0x30);
  local_db8 = 0x41f0;
  local_db4 = 0x54494245;
  local_db0 = 0;
  local_da8 = 0;
  local_da0 = "BlockAddIDValue";
  local_d98 = 0;
  local_d90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAddIDValue,&local_db8,0x30);
  local_de8 = 0x41a4;
  local_de4 = 0x47534245;
  local_de0 = 0;
  local_dd8 = 0;
  local_dd0 = "BlockAddIDName";
  local_dc8 = 0;
  local_dc0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAddIDName,&local_de8,0x30);
  local_e18 = 0x41e7;
  local_e14 = 0x54494245;
  local_e10 = 1;
  local_e08 = 0;
  local_e00 = "BlockAddIDType";
  local_df8 = 0;
  local_df0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAddIDType,&local_e18,0x30);
  local_e48 = 0x41ed;
  local_e44 = 0x4e494245;
  local_e40 = 0;
  local_e38 = 0;
  local_e30 = "BlockAddIDExtraData";
  local_e28 = 0;
  local_e20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAddIDExtraData,&local_e48,0x30);
  local_e78 = 0x41e4;
  local_e74 = 0x544d4245;
  local_e70 = 0;
  local_e68 = 0;
  local_e60 = "BlockAdditionMapping";
  local_e58 = EBML_SemanticBlockAdditionMapping;
  local_e50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBlockAdditionMapping,&local_e78,0x30);
  local_ea8 = 0x536e;
  local_ea4 = 0x55534245;
  local_ea0 = 0;
  local_e98 = 0;
  local_e90 = "Name";
  local_e88 = 0;
  local_e80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextName,&local_ea8,0x30);
  local_ed8 = 0x22b59c;
  local_ed4 = 0x47534245;
  local_ed0 = 1;
  local_ec8 = "eng";
  local_ec0 = "Language";
  local_eb8 = 0;
  local_eb0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextLanguage,&local_ed8,0x30);
  local_f08 = 0x22b59d;
  local_f04 = 0x47534245;
  local_f00 = 0;
  local_ef8 = 0;
  local_ef0 = "LanguageBCP47";
  local_ee8 = 0;
  local_ee0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextLanguageBCP47,&local_f08,0x30);
  local_f38 = 0x86;
  local_f34 = 0x47534245;
  local_f30 = 0;
  local_f28 = 0;
  local_f20 = "CodecID";
  local_f18 = 0;
  local_f10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecID,&local_f38,0x30);
  local_f68 = 0x63a2;
  local_f64 = 0x4e494245;
  local_f60 = 0;
  local_f58 = 0;
  local_f50 = "CodecPrivate";
  local_f48 = 0;
  local_f40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecPrivate,&local_f68,0x30);
  local_f98 = 0x258688;
  local_f94 = 0x55534245;
  local_f90 = 0;
  local_f88 = 0;
  local_f80 = "CodecName";
  local_f78 = 0;
  local_f70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecName,&local_f98,0x30);
  local_fc8 = 0x7446;
  local_fc4 = 0x54494245;
  local_fc0 = 0;
  local_fb8 = 0;
  local_fb0 = "AttachmentLink";
  local_fa8 = 0;
  local_fa0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAttachmentLink,&local_fc8,0x30);
  local_ff8 = 0x3a9697;
  local_ff4 = 0x55534245;
  local_ff0 = 0;
  local_fe8 = 0;
  local_fe0 = "CodecSettings";
  local_fd8 = 0;
  local_fd0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecSettings,&local_ff8,0x30);
  local_1028 = 0x3b4040;
  local_1024 = 0x47534245;
  local_1020 = 0;
  local_1018 = 0;
  local_1010 = "CodecInfoURL";
  local_1008 = 0;
  local_1000 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecInfoURL,&local_1028,0x30);
  local_1058 = 0x26b240;
  local_1054 = 0x47534245;
  local_1050 = 0;
  local_1048 = 0;
  local_1040 = "CodecDownloadURL";
  local_1038 = 0;
  local_1030 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecDownloadURL,&local_1058,0x30);
  local_1088 = 0xaa;
  local_1084 = 0x4f424245;
  local_1080 = 1;
  local_1078 = 1;
  local_1070 = "CodecDecodeAll";
  local_1068 = 0;
  local_1060 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecDecodeAll,&local_1088,0x30);
  local_10b8 = 0x6fab;
  local_10b4 = 0x54494245;
  local_10b0 = 0;
  local_10a8 = 0;
  local_10a0 = "TrackOverlay";
  local_1098 = 0;
  local_1090 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackOverlay,&local_10b8,0x30);
  local_10e8 = 0x56aa;
  local_10e4 = 0x54494245;
  local_10e0 = 1;
  local_10d8 = 0;
  local_10d0 = "CodecDelay";
  local_10c8 = 0;
  local_10c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCodecDelay,&local_10e8,0x30);
  local_1118 = 0x56bb;
  local_1114 = 0x54494245;
  local_1110 = 1;
  local_1108 = 0;
  local_1100 = "SeekPreRoll";
  local_10f8 = 0;
  local_10f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSeekPreRoll,&local_1118,0x30);
  local_1148 = 0x66a5;
  local_1144 = 0x4e494245;
  local_1140 = 0;
  local_1138 = 0;
  local_1130 = "TrackTranslateTrackID";
  local_1128 = 0;
  local_1120 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackTranslateTrackID,&local_1148,0x30);
  local_1178 = 0x66bf;
  local_1174 = 0x54494245;
  local_1170 = 0;
  local_1168 = 0;
  local_1160 = "TrackTranslateCodec";
  local_1158 = 0;
  local_1150 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackTranslateCodec,&local_1178,0x30);
  local_11a8 = 0x66fc;
  local_11a4 = 0x54494245;
  local_11a0 = 0;
  local_1198 = 0;
  local_1190 = "TrackTranslateEditionUID";
  local_1188 = 0;
  local_1180 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackTranslateEditionUID,&local_11a8,0x30);
  local_11d8 = 0x6624;
  local_11d4 = 0x544d4245;
  local_11d0 = 0;
  local_11c8 = 0;
  local_11c0 = "TrackTranslate";
  local_11b8 = EBML_SemanticTrackTranslate;
  local_11b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackTranslate,&local_11d8,0x30);
  local_1208 = 0x9a;
  local_1204 = 0x54494245;
  local_1200 = 1;
  local_11f8 = 0;
  local_11f0 = "FlagInterlaced";
  local_11e8 = 0;
  local_11e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFlagInterlaced,&local_1208,0x30);
  local_1238 = 0x9d;
  local_1234 = 0x54494245;
  local_1230 = 1;
  local_1228 = 2;
  local_1220 = "FieldOrder";
  local_1218 = 0;
  local_1210 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFieldOrder,&local_1238,0x30);
  local_1268 = 0x53b8;
  local_1264 = 0x54494245;
  local_1260 = 1;
  local_1258 = 0;
  local_1250 = "StereoMode";
  local_1248 = 0;
  local_1240 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextStereoMode,&local_1268,0x30);
  local_1298 = 0x53c0;
  local_1294 = 0x54494245;
  local_1290 = 1;
  local_1288 = 0;
  local_1280 = "AlphaMode";
  local_1278 = 0;
  local_1270 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAlphaMode,&local_1298,0x30);
  local_12c8 = 0x53b9;
  local_12c4 = 0x54494245;
  local_12c0 = 0;
  local_12b8 = 0;
  local_12b0 = "OldStereoMode";
  local_12a8 = 0;
  local_12a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextOldStereoMode,&local_12c8,0x30);
  local_12f8 = 0xb0;
  local_12f4 = 0x54494245;
  local_12f0 = 0;
  local_12e8 = 0;
  local_12e0 = "PixelWidth";
  local_12d8 = 0;
  local_12d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelWidth,&local_12f8,0x30);
  local_1328 = 0xba;
  local_1324 = 0x54494245;
  local_1320 = 0;
  local_1318 = 0;
  local_1310 = "PixelHeight";
  local_1308 = 0;
  local_1300 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelHeight,&local_1328,0x30);
  local_1358 = 0x54aa;
  local_1354 = 0x54494245;
  local_1350 = 1;
  local_1348 = 0;
  local_1340 = "PixelCropBottom";
  local_1338 = 0;
  local_1330 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelCropBottom,&local_1358,0x30);
  local_1388 = 0x54bb;
  local_1384 = 0x54494245;
  local_1380 = 1;
  local_1378 = 0;
  local_1370 = "PixelCropTop";
  local_1368 = 0;
  local_1360 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelCropTop,&local_1388,0x30);
  local_13b8 = 0x54cc;
  local_13b4 = 0x54494245;
  local_13b0 = 1;
  local_13a8 = 0;
  local_13a0 = "PixelCropLeft";
  local_1398 = 0;
  local_1390 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelCropLeft,&local_13b8,0x30);
  local_13e8 = 0x54dd;
  local_13e4 = 0x54494245;
  local_13e0 = 1;
  local_13d8 = 0;
  local_13d0 = "PixelCropRight";
  local_13c8 = 0;
  local_13c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPixelCropRight,&local_13e8,0x30);
  local_1418 = 0x54b0;
  local_1414 = 0x54494245;
  local_1410 = 0;
  local_1408 = 0;
  local_1400 = "DisplayWidth";
  local_13f8 = 0;
  local_13f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDisplayWidth,&local_1418,0x30);
  local_1448 = 0x54ba;
  local_1444 = 0x54494245;
  local_1440 = 0;
  local_1438 = 0;
  local_1430 = "DisplayHeight";
  local_1428 = 0;
  local_1420 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDisplayHeight,&local_1448,0x30);
  local_1478 = 0x54b2;
  local_1474 = 0x54494245;
  local_1470 = 1;
  local_1468 = 0;
  local_1460 = "DisplayUnit";
  local_1458 = 0;
  local_1450 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextDisplayUnit,&local_1478,0x30);
  local_14a8 = 0x54b3;
  local_14a4 = 0x54494245;
  local_14a0 = 1;
  local_1498 = 0;
  local_1490 = "AspectRatioType";
  local_1488 = 0;
  local_1480 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAspectRatioType,&local_14a8,0x30);
  local_14d8 = 0x2eb524;
  local_14d4 = 0x4e494245;
  local_14d0 = 0;
  local_14c8 = 0;
  local_14c0 = "UncompressedFourCC";
  local_14b8 = 0;
  local_14b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextUncompressedFourCC,&local_14d8,0x30);
  local_1508 = 0x2fb523;
  local_1504 = 0x4c464245;
  local_1500 = 0;
  local_14f8 = 0;
  local_14f0 = "GammaValue";
  local_14e8 = 0;
  local_14e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextGammaValue,&local_1508,0x30);
  local_1538 = 0x2383e3;
  local_1534 = 0x4c464245;
  local_1530 = 0;
  local_1528 = 0;
  local_1520 = "FrameRate";
  local_1518 = 0;
  local_1510 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFrameRate,&local_1538,0x30);
  local_1568 = 0x55b1;
  local_1564 = 0x54494245;
  local_1560 = 1;
  local_1558 = 2;
  local_1550 = "MatrixCoefficients";
  local_1548 = 0;
  local_1540 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMatrixCoefficients,&local_1568,0x30);
  local_1598 = 0x55b2;
  local_1594 = 0x54494245;
  local_1590 = 1;
  local_1588 = 0;
  local_1580 = "BitsPerChannel";
  local_1578 = 0;
  local_1570 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBitsPerChannel,&local_1598,0x30);
  local_15c8 = 0x55b3;
  local_15c4 = 0x54494245;
  local_15c0 = 0;
  local_15b8 = 0;
  local_15b0 = "ChromaSubsamplingHorz";
  local_15a8 = 0;
  local_15a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChromaSubsamplingHorz,&local_15c8,0x30);
  local_15f8 = 0x55b4;
  local_15f4 = 0x54494245;
  local_15f0 = 0;
  local_15e8 = 0;
  local_15e0 = "ChromaSubsamplingVert";
  local_15d8 = 0;
  local_15d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChromaSubsamplingVert,&local_15f8,0x30);
  local_1628 = 0x55b5;
  local_1624 = 0x54494245;
  local_1620 = 0;
  local_1618 = 0;
  local_1610 = "CbSubsamplingHorz";
  local_1608 = 0;
  local_1600 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCbSubsamplingHorz,&local_1628,0x30);
  local_1658 = 0x55b6;
  local_1654 = 0x54494245;
  local_1650 = 0;
  local_1648 = 0;
  local_1640 = "CbSubsamplingVert";
  local_1638 = 0;
  local_1630 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCbSubsamplingVert,&local_1658,0x30);
  local_1688 = 0x55b7;
  local_1684 = 0x54494245;
  local_1680 = 1;
  local_1678 = 0;
  local_1670 = "ChromaSitingHorz";
  local_1668 = 0;
  local_1660 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChromaSitingHorz,&local_1688,0x30);
  local_16b8 = 0x55b8;
  local_16b4 = 0x54494245;
  local_16b0 = 1;
  local_16a8 = 0;
  local_16a0 = "ChromaSitingVert";
  local_1698 = 0;
  local_1690 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChromaSitingVert,&local_16b8,0x30);
  local_16e8 = 0x55b9;
  local_16e4 = 0x54494245;
  local_16e0 = 1;
  local_16d8 = 0;
  local_16d0 = "Range";
  local_16c8 = 0;
  local_16c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextRange,&local_16e8,0x30);
  local_1718 = 0x55ba;
  local_1714 = 0x54494245;
  local_1710 = 1;
  local_1708 = 2;
  local_1700 = "TransferCharacteristics";
  local_16f8 = 0;
  local_16f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTransferCharacteristics,&local_1718,0x30);
  local_1748 = 0x55bb;
  local_1744 = 0x54494245;
  local_1740 = 1;
  local_1738 = 2;
  local_1730 = "Primaries";
  local_1728 = 0;
  local_1720 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaries,&local_1748,0x30);
  local_1778 = 0x55bc;
  local_1774 = 0x54494245;
  local_1770 = 0;
  local_1768 = 0;
  local_1760 = "MaxCLL";
  local_1758 = 0;
  local_1750 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMaxCLL,&local_1778,0x30);
  local_17a8 = 0x55bd;
  local_17a4 = 0x54494245;
  local_17a0 = 0;
  local_1798 = 0;
  local_1790 = "MaxFALL";
  local_1788 = 0;
  local_1780 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMaxFALL,&local_17a8,0x30);
  local_17d8 = 0x55d1;
  local_17d4 = 0x4c464245;
  local_17d0 = 0;
  local_17c8 = 0;
  local_17c0 = "PrimaryRChromaticityX";
  local_17b8 = 0;
  local_17b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryRChromaticityX,&local_17d8,0x30);
  local_1808 = 0x55d2;
  local_1804 = 0x4c464245;
  local_1800 = 0;
  local_17f8 = 0;
  local_17f0 = "PrimaryRChromaticityY";
  local_17e8 = 0;
  local_17e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryRChromaticityY,&local_1808,0x30);
  local_1838 = 0x55d3;
  local_1834 = 0x4c464245;
  local_1830 = 0;
  local_1828 = 0;
  local_1820 = "PrimaryGChromaticityX";
  local_1818 = 0;
  local_1810 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryGChromaticityX,&local_1838,0x30);
  local_1868 = 0x55d4;
  local_1864 = 0x4c464245;
  local_1860 = 0;
  local_1858 = 0;
  local_1850 = "PrimaryGChromaticityY";
  local_1848 = 0;
  local_1840 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryGChromaticityY,&local_1868,0x30);
  local_1898 = 0x55d5;
  local_1894 = 0x4c464245;
  local_1890 = 0;
  local_1888 = 0;
  local_1880 = "PrimaryBChromaticityX";
  local_1878 = 0;
  local_1870 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryBChromaticityX,&local_1898,0x30);
  local_18c8 = 0x55d6;
  local_18c4 = 0x4c464245;
  local_18c0 = 0;
  local_18b8 = 0;
  local_18b0 = "PrimaryBChromaticityY";
  local_18a8 = 0;
  local_18a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextPrimaryBChromaticityY,&local_18c8,0x30);
  local_18f8 = 0x55d7;
  local_18f4 = 0x4c464245;
  local_18f0 = 0;
  local_18e8 = 0;
  local_18e0 = "WhitePointChromaticityX";
  local_18d8 = 0;
  local_18d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextWhitePointChromaticityX,&local_18f8,0x30);
  local_1928 = 0x55d8;
  local_1924 = 0x4c464245;
  local_1920 = 0;
  local_1918 = 0;
  local_1910 = "WhitePointChromaticityY";
  local_1908 = 0;
  local_1900 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextWhitePointChromaticityY,&local_1928,0x30);
  local_1958 = 0x55d9;
  local_1954 = 0x4c464245;
  local_1950 = 0;
  local_1948 = 0;
  local_1940 = "LuminanceMax";
  local_1938 = 0;
  local_1930 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextLuminanceMax,&local_1958,0x30);
  local_1988 = 0x55da;
  local_1984 = 0x4c464245;
  local_1980 = 0;
  local_1978 = 0;
  local_1970 = "LuminanceMin";
  local_1968 = 0;
  local_1960 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextLuminanceMin,&local_1988,0x30);
  local_19b8 = 0x55d0;
  local_19b4 = 0x544d4245;
  local_19b0 = 0;
  local_19a8 = 0;
  local_19a0 = "MasteringMetadata";
  local_1998 = EBML_SemanticMasteringMetadata;
  local_1990 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextMasteringMetadata,&local_19b8,0x30);
  local_19e8 = 0x55b0;
  local_19e4 = 0x544d4245;
  local_19e0 = 0;
  local_19d8 = 0;
  local_19d0 = "Colour";
  local_19c8 = EBML_SemanticColour;
  local_19c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextColour,&local_19e8,0x30);
  local_1a18 = 0x7671;
  local_1a14 = 0x54494245;
  local_1a10 = 1;
  local_1a08 = 0;
  local_1a00 = "ProjectionType";
  local_19f8 = 0;
  local_19f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjectionType,&local_1a18,0x30);
  local_1a48 = 0x7672;
  local_1a44 = 0x4e494245;
  local_1a40 = 0;
  local_1a38 = 0;
  local_1a30 = "ProjectionPrivate";
  local_1a28 = 0;
  local_1a20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjectionPrivate,&local_1a48,0x30);
  local_1a78 = 0x7673;
  local_1a74 = 0x4c464245;
  local_1a70 = 1;
  local_1a68 = 0;
  local_1a60 = "ProjectionPoseYaw";
  local_1a58 = 0;
  local_1a50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjectionPoseYaw,&local_1a78,0x30);
  local_1aa8 = 0x7674;
  local_1aa4 = 0x4c464245;
  local_1aa0 = 1;
  local_1a98 = 0;
  local_1a90 = "ProjectionPosePitch";
  local_1a88 = 0;
  local_1a80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjectionPosePitch,&local_1aa8,0x30);
  local_1ad8 = 0x7675;
  local_1ad4 = 0x4c464245;
  local_1ad0 = 1;
  local_1ac8 = 0;
  local_1ac0 = "ProjectionPoseRoll";
  local_1ab8 = 0;
  local_1ab0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjectionPoseRoll,&local_1ad8,0x30);
  local_1b08 = 0x7670;
  local_1b04 = 0x544d4245;
  local_1b00 = 0;
  local_1af8 = 0;
  local_1af0 = "Projection";
  local_1ae8 = EBML_SemanticProjection;
  local_1ae0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextProjection,&local_1b08,0x30);
  local_1b38 = 0xe0;
  local_1b34 = 0x544d4245;
  local_1b30 = 0;
  local_1b28 = 0;
  local_1b20 = "Video";
  local_1b18 = EBML_SemanticVideo;
  local_1b10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextVideo,&local_1b38,0x30);
  local_1b68 = 0xb5;
  local_1b64 = 0x4c464245;
  local_1b60 = 1;
  local_1b58 = 8000;
  local_1b50 = "SamplingFrequency";
  local_1b48 = 0;
  local_1b40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSamplingFrequency,&local_1b68,0x30);
  local_1b98 = 0x78b5;
  local_1b94 = 0x4c464245;
  local_1b90 = 0;
  local_1b88 = 0;
  local_1b80 = "OutputSamplingFrequency";
  local_1b78 = 0;
  local_1b70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextOutputSamplingFrequency,&local_1b98,0x30);
  local_1bc8 = 0x9f;
  local_1bc4 = 0x54494245;
  local_1bc0 = 1;
  local_1bb8 = 1;
  local_1bb0 = "Channels";
  local_1ba8 = 0;
  local_1ba0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChannels,&local_1bc8,0x30);
  local_1bf8 = 0x7d7b;
  local_1bf4 = 0x4e494245;
  local_1bf0 = 0;
  local_1be8 = 0;
  local_1be0 = "ChannelPositions";
  local_1bd8 = 0;
  local_1bd0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChannelPositions,&local_1bf8,0x30);
  local_1c28 = 0x6264;
  local_1c24 = 0x54494245;
  local_1c20 = 0;
  local_1c18 = 0;
  local_1c10 = "BitDepth";
  local_1c08 = 0;
  local_1c00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextBitDepth,&local_1c28,0x30);
  local_1c58 = 0x52f1;
  local_1c54 = 0x54494245;
  local_1c50 = 1;
  local_1c48 = 0;
  local_1c40 = "Emphasis";
  local_1c38 = 0;
  local_1c30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEmphasis,&local_1c58,0x30);
  local_1c88 = 0xe1;
  local_1c84 = 0x544d4245;
  local_1c80 = 0;
  local_1c78 = 0;
  local_1c70 = "Audio";
  local_1c68 = EBML_SemanticAudio;
  local_1c60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAudio,&local_1c88,0x30);
  local_1cb8 = 0xe5;
  local_1cb4 = 0x54494245;
  local_1cb0 = 0;
  local_1ca8 = 0;
  local_1ca0 = "TrackPlaneUID";
  local_1c98 = 0;
  local_1c90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackPlaneUID,&local_1cb8,0x30);
  local_1ce8 = 0xe6;
  local_1ce4 = 0x54494245;
  local_1ce0 = 0;
  local_1cd8 = 0;
  local_1cd0 = "TrackPlaneType";
  local_1cc8 = 0;
  local_1cc0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackPlaneType,&local_1ce8,0x30);
  local_1d18 = 0xe4;
  local_1d14 = 0x544d4245;
  local_1d10 = 0;
  local_1d08 = 0;
  local_1d00 = "TrackPlane";
  local_1cf8 = EBML_SemanticTrackPlane;
  local_1cf0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackPlane,&local_1d18,0x30);
  local_1d48 = 0xe3;
  local_1d44 = 0x544d4245;
  local_1d40 = 0;
  local_1d38 = 0;
  local_1d30 = "TrackCombinePlanes";
  local_1d28 = EBML_SemanticTrackCombinePlanes;
  local_1d20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackCombinePlanes,&local_1d48,0x30);
  local_1d78 = 0xed;
  local_1d74 = 0x54494245;
  local_1d70 = 0;
  local_1d68 = 0;
  local_1d60 = "TrackJoinUID";
  local_1d58 = 0;
  local_1d50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackJoinUID,&local_1d78,0x30);
  local_1da8 = 0xe9;
  local_1da4 = 0x544d4245;
  local_1da0 = 0;
  local_1d98 = 0;
  local_1d90 = "TrackJoinBlocks";
  local_1d88 = EBML_SemanticTrackJoinBlocks;
  local_1d80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackJoinBlocks,&local_1da8,0x30);
  local_1dd8 = 0xe2;
  local_1dd4 = 0x544d4245;
  local_1dd0 = 0;
  local_1dc8 = 0;
  local_1dc0 = "TrackOperation";
  local_1db8 = EBML_SemanticTrackOperation;
  local_1db0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackOperation,&local_1dd8,0x30);
  local_1e08 = 0xc0;
  local_1e04 = 0x54494245;
  local_1e00 = 0;
  local_1df8 = 0;
  local_1df0 = "TrickTrackUID";
  local_1de8 = 0;
  local_1de0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrickTrackUID,&local_1e08,0x30);
  local_1e38 = 0xc1;
  local_1e34 = 0x44494b4d;
  local_1e30 = 0;
  local_1e28 = 0;
  local_1e20 = "TrickTrackSegmentUID";
  local_1e18 = 0;
  local_1e10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrickTrackSegmentUID,&local_1e38,0x30);
  local_1e68 = 0xc6;
  local_1e64 = 0x54494245;
  local_1e60 = 1;
  local_1e58 = 0;
  local_1e50 = "TrickTrackFlag";
  local_1e48 = 0;
  local_1e40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrickTrackFlag,&local_1e68,0x30);
  local_1e98 = 199;
  local_1e94 = 0x54494245;
  local_1e90 = 0;
  local_1e88 = 0;
  local_1e80 = "TrickMasterTrackUID";
  local_1e78 = 0;
  local_1e70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrickMasterTrackUID,&local_1e98,0x30);
  local_1ec8 = 0xc4;
  local_1ec4 = 0x44494b4d;
  local_1ec0 = 0;
  local_1eb8 = 0;
  local_1eb0 = "TrickMasterTrackSegmentUID";
  local_1ea8 = 0;
  local_1ea0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrickMasterTrackSegmentUID,&local_1ec8,0x30);
  local_1ef8 = 0x5031;
  local_1ef4 = 0x54494245;
  local_1ef0 = 1;
  local_1ee8 = 0;
  local_1ee0 = "ContentEncodingOrder";
  local_1ed8 = 0;
  local_1ed0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncodingOrder,&local_1ef8,0x30);
  local_1f28 = 0x5032;
  local_1f24 = 0x54494245;
  local_1f20 = 1;
  local_1f18 = 1;
  local_1f10 = "ContentEncodingScope";
  local_1f08 = 0;
  local_1f00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncodingScope,&local_1f28,0x30);
  local_1f58 = 0x5033;
  local_1f54 = 0x54494245;
  local_1f50 = 1;
  local_1f48 = 0;
  local_1f40 = "ContentEncodingType";
  local_1f38 = 0;
  local_1f30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncodingType,&local_1f58,0x30);
  local_1f88 = 0x4254;
  local_1f84 = 0x54494245;
  local_1f80 = 1;
  local_1f78 = 0;
  local_1f70 = "ContentCompAlgo";
  local_1f68 = 0;
  local_1f60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentCompAlgo,&local_1f88,0x30);
  local_1fb8 = 0x4255;
  local_1fb4 = 0x4e494245;
  local_1fb0 = 0;
  local_1fa8 = 0;
  local_1fa0 = "ContentCompSettings";
  local_1f98 = 0;
  local_1f90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentCompSettings,&local_1fb8,0x30);
  local_1fe8 = 0x5034;
  local_1fe4 = 0x544d4245;
  local_1fe0 = 0;
  local_1fd8 = 0;
  local_1fd0 = "ContentCompression";
  local_1fc8 = EBML_SemanticContentCompression;
  local_1fc0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentCompression,&local_1fe8,0x30);
  local_2018 = 0x47e1;
  local_2014 = 0x54494245;
  local_2010 = 1;
  local_2008 = 0;
  local_2000 = "ContentEncAlgo";
  local_1ff8 = 0;
  local_1ff0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncAlgo,&local_2018,0x30);
  local_2048 = 0x47e2;
  local_2044 = 0x4e494245;
  local_2040 = 0;
  local_2038 = 0;
  local_2030 = "ContentEncKeyID";
  local_2028 = 0;
  local_2020 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncKeyID,&local_2048,0x30);
  local_2078 = 0x47e8;
  local_2074 = 0x54494245;
  local_2070 = 0;
  local_2068 = 0;
  local_2060 = "AESSettingsCipherMode";
  local_2058 = 0;
  local_2050 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAESSettingsCipherMode,&local_2078,0x30);
  local_20a8 = 0x47e7;
  local_20a4 = 0x544d4245;
  local_20a0 = 0;
  local_2098 = 0;
  local_2090 = "ContentEncAESSettings";
  local_2088 = EBML_SemanticContentEncAESSettings;
  local_2080 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncAESSettings,&local_20a8,0x30);
  local_20d8 = 0x47e3;
  local_20d4 = 0x4e494245;
  local_20d0 = 0;
  local_20c8 = 0;
  local_20c0 = "ContentSignature";
  local_20b8 = 0;
  local_20b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentSignature,&local_20d8,0x30);
  local_2108 = 0x47e4;
  local_2104 = 0x4e494245;
  local_2100 = 0;
  local_20f8 = 0;
  local_20f0 = "ContentSigKeyID";
  local_20e8 = 0;
  local_20e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentSigKeyID,&local_2108,0x30);
  local_2138 = 0x47e5;
  local_2134 = 0x54494245;
  local_2130 = 1;
  local_2128 = 0;
  local_2120 = "ContentSigAlgo";
  local_2118 = 0;
  local_2110 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentSigAlgo,&local_2138,0x30);
  local_2168 = 0x47e6;
  local_2164 = 0x54494245;
  local_2160 = 1;
  local_2158 = 0;
  local_2150 = "ContentSigHashAlgo";
  local_2148 = 0;
  local_2140 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentSigHashAlgo,&local_2168,0x30);
  local_2198 = 0x5035;
  local_2194 = 0x544d4245;
  local_2190 = 0;
  local_2188 = 0;
  local_2180 = "ContentEncryption";
  local_2178 = EBML_SemanticContentEncryption;
  local_2170 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncryption,&local_2198,0x30);
  local_21c8 = 0x6240;
  local_21c4 = 0x544d4245;
  local_21c0 = 0;
  local_21b8 = 0;
  local_21b0 = "ContentEncoding";
  local_21a8 = EBML_SemanticContentEncoding;
  local_21a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncoding,&local_21c8,0x30);
  local_21f8 = 0x6d80;
  local_21f4 = 0x544d4245;
  local_21f0 = 0;
  local_21e8 = 0;
  local_21e0 = "ContentEncodings";
  local_21d8 = EBML_SemanticContentEncodings;
  local_21d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextContentEncodings,&local_21f8,0x30);
  local_2228 = 0xae;
  local_2224 = 0x45544b4d;
  local_2220 = 0;
  local_2218 = 0;
  local_2210 = "TrackEntry";
  local_2208 = EBML_SemanticTrackEntry;
  local_2200 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTrackEntry,&local_2228,0x30);
  local_2258 = 0x1654ae6b;
  local_2254 = 0x544d4245;
  local_2250 = 0;
  local_2248 = 0;
  local_2240 = "Tracks";
  local_2238 = EBML_SemanticTracks;
  local_2230 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTracks,&local_2258,0x30);
  local_2288 = 0xb3;
  local_2284 = 0x54494245;
  local_2280 = 0;
  local_2278 = 0;
  local_2270 = "CueTime";
  local_2268 = 0;
  local_2260 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueTime,&local_2288,0x30);
  local_22b8 = 0xf7;
  local_22b4 = 0x54494245;
  local_22b0 = 0;
  local_22a8 = 0;
  local_22a0 = "CueTrack";
  local_2298 = 0;
  local_2290 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueTrack,&local_22b8,0x30);
  local_22e8 = 0xf1;
  local_22e4 = 0x54494245;
  local_22e0 = 0;
  local_22d8 = 0;
  local_22d0 = "CueClusterPosition";
  local_22c8 = 0;
  local_22c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueClusterPosition,&local_22e8,0x30);
  local_2318 = 0xf0;
  local_2314 = 0x54494245;
  local_2310 = 0;
  local_2308 = 0;
  local_2300 = "CueRelativePosition";
  local_22f8 = 0;
  local_22f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueRelativePosition,&local_2318,0x30);
  local_2348 = 0xb2;
  local_2344 = 0x54494245;
  local_2340 = 0;
  local_2338 = 0;
  local_2330 = "CueDuration";
  local_2328 = 0;
  local_2320 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueDuration,&local_2348,0x30);
  local_2378 = 0x5378;
  local_2374 = 0x54494245;
  local_2370 = 0;
  local_2368 = 0;
  local_2360 = "CueBlockNumber";
  local_2358 = 0;
  local_2350 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueBlockNumber,&local_2378,0x30);
  local_23a8 = 0xea;
  local_23a4 = 0x54494245;
  local_23a0 = 1;
  local_2398 = 0;
  local_2390 = "CueCodecState";
  local_2388 = 0;
  local_2380 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueCodecState,&local_23a8,0x30);
  local_23d8 = 0x96;
  local_23d4 = 0x54494245;
  local_23d0 = 0;
  local_23c8 = 0;
  local_23c0 = "CueRefTime";
  local_23b8 = 0;
  local_23b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueRefTime,&local_23d8,0x30);
  local_2408 = 0x97;
  local_2404 = 0x54494245;
  local_2400 = 0;
  local_23f8 = 0;
  local_23f0 = "CueRefCluster";
  local_23e8 = 0;
  local_23e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueRefCluster,&local_2408,0x30);
  local_2438 = 0x535f;
  local_2434 = 0x54494245;
  local_2430 = 1;
  local_2428 = 1;
  local_2420 = "CueRefNumber";
  local_2418 = 0;
  local_2410 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueRefNumber,&local_2438,0x30);
  local_2468 = 0xeb;
  local_2464 = 0x54494245;
  local_2460 = 1;
  local_2458 = 0;
  local_2450 = "CueRefCodecState";
  local_2448 = 0;
  local_2440 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueRefCodecState,&local_2468,0x30);
  local_2498 = 0xdb;
  local_2494 = 0x544d4245;
  local_2490 = 0;
  local_2488 = 0;
  local_2480 = "CueReference";
  local_2478 = EBML_SemanticCueReference;
  local_2470 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueReference,&local_2498,0x30);
  local_24c8 = 0xb7;
  local_24c4 = 0x544d4245;
  local_24c0 = 0;
  local_24b8 = 0;
  local_24b0 = "CueTrackPositions";
  local_24a8 = EBML_SemanticCueTrackPositions;
  local_24a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCueTrackPositions,&local_24c8,0x30);
  local_24f8 = 0xbb;
  local_24f4 = 0x50434b4d;
  local_24f0 = 0;
  local_24e8 = 0;
  local_24e0 = "CuePoint";
  local_24d8 = EBML_SemanticCuePoint;
  local_24d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCuePoint,&local_24f8,0x30);
  local_2528 = 0x1c53bb6b;
  local_2524 = 0x544d4245;
  local_2520 = 0;
  local_2518 = 0;
  local_2510 = "Cues";
  local_2508 = EBML_SemanticCues;
  local_2500 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextCues,&local_2528,0x30);
  local_2558 = 0x467e;
  local_2554 = 0x55534245;
  local_2550 = 0;
  local_2548 = 0;
  local_2540 = "FileDescription";
  local_2538 = 0;
  local_2530 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileDescription,&local_2558,0x30);
  local_2588 = 0x466e;
  local_2584 = 0x55534245;
  local_2580 = 0;
  local_2578 = 0;
  local_2570 = "FileName";
  local_2568 = 0;
  local_2560 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileName,&local_2588,0x30);
  local_25b8 = 0x4660;
  local_25b4 = 0x47534245;
  local_25b0 = 0;
  local_25a8 = 0;
  local_25a0 = "FileMediaType";
  local_2598 = 0;
  local_2590 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileMediaType,&local_25b8,0x30);
  local_25e8 = 0x465c;
  local_25e4 = 0x42424b4d;
  local_25e0 = 0;
  local_25d8 = 0;
  local_25d0 = "FileData";
  local_25c8 = 0;
  local_25c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileData,&local_25e8,0x30);
  local_2618 = 0x46ae;
  local_2614 = 0x54494245;
  local_2610 = 0;
  local_2608 = 0;
  local_2600 = "FileUID";
  local_25f8 = 0;
  local_25f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileUID,&local_2618,0x30);
  local_2648 = 0x4675;
  local_2644 = 0x4e494245;
  local_2640 = 0;
  local_2638 = 0;
  local_2630 = "FileReferral";
  local_2628 = 0;
  local_2620 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileReferral,&local_2648,0x30);
  local_2678 = 0x4661;
  local_2674 = 0x54494245;
  local_2670 = 0;
  local_2668 = 0;
  local_2660 = "FileUsedStartTime";
  local_2658 = 0;
  local_2650 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileUsedStartTime,&local_2678,0x30);
  local_26a8 = 0x4662;
  local_26a4 = 0x54494245;
  local_26a0 = 0;
  local_2698 = 0;
  local_2690 = "FileUsedEndTime";
  local_2688 = 0;
  local_2680 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextFileUsedEndTime,&local_26a8,0x30);
  local_26d8 = 24999;
  local_26d4 = 0x54414b4d;
  local_26d0 = 0;
  local_26c8 = 0;
  local_26c0 = "AttachedFile";
  local_26b8 = EBML_SemanticAttachedFile;
  local_26b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAttachedFile,&local_26d8,0x30);
  local_2708 = 0x1941a469;
  local_2704 = 0x544d4245;
  local_2700 = 0;
  local_26f8 = 0;
  local_26f0 = "Attachments";
  local_26e8 = EBML_SemanticAttachments;
  local_26e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextAttachments,&local_2708,0x30);
  local_2738 = 0x45bc;
  local_2734 = 0x54494245;
  local_2730 = 0;
  local_2728 = 0;
  local_2720 = "EditionUID";
  local_2718 = 0;
  local_2710 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionUID,&local_2738,0x30);
  local_2768 = 0x45bd;
  local_2764 = 0x4f424245;
  local_2760 = 1;
  local_2758 = 0;
  local_2750 = "EditionFlagHidden";
  local_2748 = 0;
  local_2740 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionFlagHidden,&local_2768,0x30);
  local_2798 = 0x45db;
  local_2794 = 0x4f424245;
  local_2790 = 1;
  local_2788 = 0;
  local_2780 = "EditionFlagDefault";
  local_2778 = 0;
  local_2770 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionFlagDefault,&local_2798,0x30);
  local_27c8 = 0x45dd;
  local_27c4 = 0x4f424245;
  local_27c0 = 1;
  local_27b8 = 0;
  local_27b0 = "EditionFlagOrdered";
  local_27a8 = 0;
  local_27a0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionFlagOrdered,&local_27c8,0x30);
  local_27f8 = 0x4521;
  local_27f4 = 0x55534245;
  local_27f0 = 0;
  local_27e8 = 0;
  local_27e0 = "EditionString";
  local_27d8 = 0;
  local_27d0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionString,&local_27f8,0x30);
  local_2828 = 0x45e4;
  local_2824 = 0x47534245;
  local_2820 = 0;
  local_2818 = 0;
  local_2810 = "EditionLanguageIETF";
  local_2808 = 0;
  local_2800 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionLanguageIETF,&local_2828,0x30);
  local_2858 = 0x4520;
  local_2854 = 0x544d4245;
  local_2850 = 0;
  local_2848 = 0;
  local_2840 = "EditionDisplay";
  local_2838 = EBML_SemanticEditionDisplay;
  local_2830 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionDisplay,&local_2858,0x30);
  local_2888 = 0x73c4;
  local_2884 = 0x54494245;
  local_2880 = 0;
  local_2878 = 0;
  local_2870 = "ChapterUID";
  local_2868 = 0;
  local_2860 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterUID,&local_2888,0x30);
  local_28b8 = 0x5654;
  local_28b4 = 0x55534245;
  local_28b0 = 0;
  local_28a8 = 0;
  local_28a0 = "ChapterStringUID";
  local_2898 = 0;
  local_2890 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterStringUID,&local_28b8,0x30);
  local_28e8 = 0x91;
  local_28e4 = 0x54494245;
  local_28e0 = 0;
  local_28d8 = 0;
  local_28d0 = "ChapterTimeStart";
  local_28c8 = 0;
  local_28c0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTimeStart,&local_28e8,0x30);
  local_2918 = 0x92;
  local_2914 = 0x54494245;
  local_2910 = 0;
  local_2908 = 0;
  local_2900 = "ChapterTimeEnd";
  local_28f8 = 0;
  local_28f0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTimeEnd,&local_2918,0x30);
  local_2948 = 0x98;
  local_2944 = 0x4f424245;
  local_2940 = 1;
  local_2938 = 0;
  local_2930 = "ChapterFlagHidden";
  local_2928 = 0;
  local_2920 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterFlagHidden,&local_2948,0x30);
  local_2978 = 0x4598;
  local_2974 = 0x4f424245;
  local_2970 = 1;
  local_2968 = 1;
  local_2960 = "ChapterFlagEnabled";
  local_2958 = 0;
  local_2950 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterFlagEnabled,&local_2978,0x30);
  local_29a8 = 0x6e67;
  local_29a4 = 0x44494b4d;
  local_29a0 = 0;
  local_2998 = 0;
  local_2990 = "ChapterSegmentUUID";
  local_2988 = 0;
  local_2980 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterSegmentUUID,&local_29a8,0x30);
  local_29d8 = 0x4588;
  local_29d4 = 0x54494245;
  local_29d0 = 0;
  local_29c8 = 0;
  local_29c0 = "ChapterSkipType";
  local_29b8 = 0;
  local_29b0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterSkipType,&local_29d8,0x30);
  local_2a08 = 0x6ebc;
  local_2a04 = 0x54494245;
  local_2a00 = 0;
  local_29f8 = 0;
  local_29f0 = "ChapterSegmentEditionUID";
  local_29e8 = 0;
  local_29e0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterSegmentEditionUID,&local_2a08,0x30);
  local_2a38 = 0x63c3;
  local_2a34 = 0x54494245;
  local_2a30 = 0;
  local_2a28 = 0;
  local_2a20 = "ChapterPhysicalEquiv";
  local_2a18 = 0;
  local_2a10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterPhysicalEquiv,&local_2a38,0x30);
  local_2a68 = 0x89;
  local_2a64 = 0x54494245;
  local_2a60 = 0;
  local_2a58 = 0;
  local_2a50 = "ChapterTrackNumber";
  local_2a48 = 0;
  local_2a40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTrackNumber,&local_2a68,0x30);
  local_2a98 = 0x8f;
  local_2a94 = 0x544d4245;
  local_2a90 = 0;
  local_2a88 = 0;
  local_2a80 = "ChapterTrack";
  local_2a78 = EBML_SemanticChapterTrack;
  local_2a70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterTrack,&local_2a98,0x30);
  local_2ac8 = 0x85;
  local_2ac4 = 0x55534245;
  local_2ac0 = 0;
  local_2ab8 = 0;
  local_2ab0 = "ChapString";
  local_2aa8 = 0;
  local_2aa0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapString,&local_2ac8,0x30);
  local_2af8 = 0x437c;
  local_2af4 = 0x47534245;
  local_2af0 = 1;
  local_2ae8 = "eng";
  local_2ae0 = "ChapLanguage";
  local_2ad8 = 0;
  local_2ad0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapLanguage,&local_2af8,0x30);
  local_2b28 = 0x437d;
  local_2b24 = 0x47534245;
  local_2b20 = 0;
  local_2b18 = 0;
  local_2b10 = "ChapLanguageBCP47";
  local_2b08 = 0;
  local_2b00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapLanguageBCP47,&local_2b28,0x30);
  local_2b58 = 0x437e;
  local_2b54 = 0x47534245;
  local_2b50 = 0;
  local_2b48 = 0;
  local_2b40 = "ChapCountry";
  local_2b38 = 0;
  local_2b30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapCountry,&local_2b58,0x30);
  local_2b88 = 0x80;
  local_2b84 = 0x544d4245;
  local_2b80 = 0;
  local_2b78 = 0;
  local_2b70 = "ChapterDisplay";
  local_2b68 = EBML_SemanticChapterDisplay;
  local_2b60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterDisplay,&local_2b88,0x30);
  local_2bb8 = 0x6955;
  local_2bb4 = 0x54494245;
  local_2bb0 = 1;
  local_2ba8 = 0;
  local_2ba0 = "ChapProcessCodecID";
  local_2b98 = 0;
  local_2b90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcessCodecID,&local_2bb8,0x30);
  local_2be8 = 0x450d;
  local_2be4 = 0x4e494245;
  local_2be0 = 0;
  local_2bd8 = 0;
  local_2bd0 = "ChapProcessPrivate";
  local_2bc8 = 0;
  local_2bc0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcessPrivate,&local_2be8,0x30);
  local_2c18 = 0x6922;
  local_2c14 = 0x54494245;
  local_2c10 = 0;
  local_2c08 = 0;
  local_2c00 = "ChapProcessTime";
  local_2bf8 = 0;
  local_2bf0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcessTime,&local_2c18,0x30);
  local_2c48 = 0x6933;
  local_2c44 = 0x4e494245;
  local_2c40 = 0;
  local_2c38 = 0;
  local_2c30 = "ChapProcessData";
  local_2c28 = 0;
  local_2c20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcessData,&local_2c48,0x30);
  local_2c78 = 0x6911;
  local_2c74 = 0x544d4245;
  local_2c70 = 0;
  local_2c68 = 0;
  local_2c60 = "ChapProcessCommand";
  local_2c58 = EBML_SemanticChapProcessCommand;
  local_2c50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcessCommand,&local_2c78,0x30);
  local_2ca8 = 0x6944;
  local_2ca4 = 0x544d4245;
  local_2ca0 = 0;
  local_2c98 = 0;
  local_2c90 = "ChapProcess";
  local_2c88 = EBML_SemanticChapProcess;
  local_2c80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapProcess,&local_2ca8,0x30);
  local_2cd8 = 0xb6;
  local_2cd4 = 0x544d4245;
  local_2cd0 = 0;
  local_2cc8 = 0;
  local_2cc0 = "ChapterAtom";
  local_2cb8 = EBML_SemanticChapterAtom;
  local_2cb0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapterAtom,&local_2cd8,0x30);
  local_2d08 = 0x45b9;
  local_2d04 = 0x544d4245;
  local_2d00 = 0;
  local_2cf8 = 0;
  local_2cf0 = "EditionEntry";
  local_2ce8 = EBML_SemanticEditionEntry;
  local_2ce0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextEditionEntry,&local_2d08,0x30);
  local_2d38 = 0x1043a770;
  local_2d34 = 0x544d4245;
  local_2d30 = 0;
  local_2d28 = 0;
  local_2d20 = "Chapters";
  local_2d18 = EBML_SemanticChapters;
  local_2d10 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextChapters,&local_2d38,0x30);
  local_2d68 = 0x68ca;
  local_2d64 = 0x54494245;
  local_2d60 = 1;
  local_2d58 = 0x32;
  local_2d50 = "TargetTypeValue";
  local_2d48 = 0;
  local_2d40 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTargetTypeValue,&local_2d68,0x30);
  local_2d98 = 0x63ca;
  local_2d94 = 0x47534245;
  local_2d90 = 0;
  local_2d88 = 0;
  local_2d80 = "TargetType";
  local_2d78 = 0;
  local_2d70 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTargetType,&local_2d98,0x30);
  local_2dc8 = 0x63c5;
  local_2dc4 = 0x54494245;
  local_2dc0 = 1;
  local_2db8 = 0;
  local_2db0 = "TagTrackUID";
  local_2da8 = 0;
  local_2da0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagTrackUID,&local_2dc8,0x30);
  local_2df8 = 0x63c9;
  local_2df4 = 0x54494245;
  local_2df0 = 1;
  local_2de8 = 0;
  local_2de0 = "TagEditionUID";
  local_2dd8 = 0;
  local_2dd0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagEditionUID,&local_2df8,0x30);
  local_2e28 = 0x63c4;
  local_2e24 = 0x54494245;
  local_2e20 = 1;
  local_2e18 = 0;
  local_2e10 = "TagChapterUID";
  local_2e08 = 0;
  local_2e00 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagChapterUID,&local_2e28,0x30);
  local_2e58 = 0x63c6;
  local_2e54 = 0x54494245;
  local_2e50 = 1;
  local_2e48 = 0;
  local_2e40 = "TagAttachmentUID";
  local_2e38 = 0;
  local_2e30 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagAttachmentUID,&local_2e58,0x30);
  local_2e88 = 0x63c0;
  local_2e84 = 0x544d4245;
  local_2e80 = 0;
  local_2e78 = 0;
  local_2e70 = "Targets";
  local_2e68 = EBML_SemanticTargets;
  local_2e60 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTargets,&local_2e88,0x30);
  local_2eb8 = 0x45a3;
  local_2eb4 = 0x55534245;
  local_2eb0 = 0;
  local_2ea8 = 0;
  local_2ea0 = "TagName";
  local_2e98 = 0;
  local_2e90 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagName,&local_2eb8,0x30);
  local_2ee8 = 0x447a;
  local_2ee4 = 0x47534245;
  local_2ee0 = 1;
  local_2ed8 = "und";
  local_2ed0 = "TagLanguage";
  local_2ec8 = 0;
  local_2ec0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagLanguage,&local_2ee8,0x30);
  local_2f18 = 0x447b;
  local_2f14 = 0x47534245;
  local_2f10 = 0;
  local_2f08 = 0;
  local_2f00 = "TagLanguageBCP47";
  local_2ef8 = 0;
  local_2ef0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagLanguageBCP47,&local_2f18,0x30);
  local_2f48 = 0x4484;
  local_2f44 = 0x4f424245;
  local_2f40 = 1;
  local_2f38 = 1;
  local_2f30 = "TagDefault";
  local_2f28 = 0;
  local_2f20 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagDefault,&local_2f48,0x30);
  local_2f78 = 0x44b4;
  local_2f74 = 0x4f424245;
  local_2f70 = 1;
  local_2f68 = 1;
  local_2f60 = "TagDefaultBogus";
  local_2f58 = 0;
  local_2f50 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagDefaultBogus,&local_2f78,0x30);
  local_2fa8 = 0x4487;
  local_2fa4 = 0x55534245;
  local_2fa0 = 0;
  local_2f98 = 0;
  local_2f90 = "TagString";
  local_2f88 = 0;
  local_2f80 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagString,&local_2fa8,0x30);
  local_2fd8 = 0x4485;
  local_2fd4 = 0x4e494245;
  local_2fd0 = 0;
  local_2fc8 = 0;
  local_2fc0 = "TagBinary";
  local_2fb8 = 0;
  local_2fb0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTagBinary,&local_2fd8,0x30);
  local_3008 = 0x67c8;
  local_3004 = 0x544d4245;
  local_3000 = 0;
  local_2ff8 = 0;
  local_2ff0 = "SimpleTag";
  local_2fe8 = EBML_SemanticSimpleTag;
  local_2fe0 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSimpleTag,&local_3008,0x30);
  local_3038 = 0x7373;
  local_3034 = 0x544d4245;
  local_3030 = 0;
  local_3028 = 0;
  local_3020 = "Tag";
  local_3018 = EBML_SemanticTag;
  local_3010 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTag,&local_3038,0x30);
  local_3068 = 0x1254c367;
  local_3064 = 0x544d4245;
  local_3060 = 0;
  local_3058 = 0;
  local_3050 = "Tags";
  local_3048 = EBML_SemanticTags;
  local_3040 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextTags,&local_3068,0x30);
  local_3098 = 0x18538067;
  local_3094 = 0x544d4245;
  local_3090 = 0;
  local_3088 = 0;
  local_3080 = "Segment";
  local_3078 = EBML_SemanticSegment;
  local_3070 = EBML_getSemanticGlobals();
  memcpy(&MATROSKA_ContextSegment,&local_3098,0x30);
  return;
}

Assistant:

void MATROSKA_InitSemantic(void)
{
    MATROSKA_ContextSeekID = (ebml_context) {0x53AB, EBML_BINARY_CLASS, 0, 0, "SeekID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekPosition = (ebml_context) {0x53AC, EBML_INTEGER_CLASS, 0, 0, "SeekPosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeek = (ebml_context) {0x4DBB, MATROSKA_SEEKPOINT_CLASS, 0, 0, "Seek", EBML_SemanticSeek, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekHead = (ebml_context) {0x114D9B74, EBML_MASTER_CLASS, 0, 0, "SeekHead", EBML_SemanticSeekHead, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentUUID = (ebml_context) {0x73A4, MATROSKA_SEGMENTUID_CLASS, 0, 0, "SegmentUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentFilename = (ebml_context) {0x7384, EBML_UNISTRING_CLASS, 0, 0, "SegmentFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevUUID = (ebml_context) {0x3CB923, MATROSKA_SEGMENTUID_CLASS, 0, 0, "PrevUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevFilename = (ebml_context) {0x3C83AB, EBML_UNISTRING_CLASS, 0, 0, "PrevFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextNextUUID = (ebml_context) {0x3EB923, MATROSKA_SEGMENTUID_CLASS, 0, 0, "NextUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextNextFilename = (ebml_context) {0x3E83BB, EBML_UNISTRING_CLASS, 0, 0, "NextFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentFamily = (ebml_context) {0x4444, MATROSKA_SEGMENTUID_CLASS, 0, 0, "SegmentFamily", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateID = (ebml_context) {0x69A5, EBML_BINARY_CLASS, 0, 0, "ChapterTranslateID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateCodec = (ebml_context) {0x69BF, EBML_INTEGER_CLASS, 0, 0, "ChapterTranslateCodec", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateEditionUID = (ebml_context) {0x69FC, EBML_INTEGER_CLASS, 0, 0, "ChapterTranslateEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslate = (ebml_context) {0x6924, EBML_MASTER_CLASS, 0, 0, "ChapterTranslate", EBML_SemanticChapterTranslate, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimestampScale = (ebml_context) {0x2AD7B1, EBML_INTEGER_CLASS, 1, 1000000, "TimestampScale", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDuration = (ebml_context) {0x4489, EBML_FLOAT_CLASS, 0, 0, "Duration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDateUTC = (ebml_context) {0x4461, EBML_DATE_CLASS, 0, 0, "DateUTC", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTitle = (ebml_context) {0x7BA9, EBML_UNISTRING_CLASS, 0, 0, "Title", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMuxingApp = (ebml_context) {0x4D80, EBML_UNISTRING_CLASS, 0, 0, "MuxingApp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWritingApp = (ebml_context) {0x5741, EBML_UNISTRING_CLASS, 0, 0, "WritingApp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextInfo = (ebml_context) {0x1549A966, EBML_MASTER_CLASS, 0, 0, "Info", EBML_SemanticInfo, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimestamp = (ebml_context) {0xE7, EBML_INTEGER_CLASS, 0, 0, "Timestamp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSilentTrackNumber = (ebml_context) {0x58D7, EBML_INTEGER_CLASS, 0, 0, "SilentTrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSilentTracks = (ebml_context) {0x5854, EBML_MASTER_CLASS, 0, 0, "SilentTracks", EBML_SemanticSilentTracks, EBML_getSemanticGlobals()};
    MATROSKA_ContextPosition = (ebml_context) {0xA7, EBML_INTEGER_CLASS, 0, 0, "Position", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevSize = (ebml_context) {0xAB, EBML_INTEGER_CLASS, 0, 0, "PrevSize", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSimpleBlock = (ebml_context) {0xA3, MATROSKA_BLOCK_CLASS, 0, 0, "SimpleBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlock = (ebml_context) {0xA1, MATROSKA_BLOCK_CLASS, 0, 0, "Block", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockVirtual = (ebml_context) {0xA2, EBML_BINARY_CLASS, 0, 0, "BlockVirtual", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditional = (ebml_context) {0xA5, EBML_BINARY_CLASS, 0, 0, "BlockAdditional", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddID = (ebml_context) {0xEE, EBML_INTEGER_CLASS, 1, 1, "BlockAddID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockMore = (ebml_context) {0xA6, EBML_MASTER_CLASS, 0, 0, "BlockMore", EBML_SemanticBlockMore, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditions = (ebml_context) {0x75A1, EBML_MASTER_CLASS, 0, 0, "BlockAdditions", EBML_SemanticBlockAdditions, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockDuration = (ebml_context) {0x9B, EBML_INTEGER_CLASS, 0, 0, "BlockDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferencePriority = (ebml_context) {0xFA, EBML_INTEGER_CLASS, 1, 0, "ReferencePriority", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceBlock = (ebml_context) {0xFB, EBML_SINTEGER_CLASS, 0, 0, "ReferenceBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceVirtual = (ebml_context) {0xFD, EBML_SINTEGER_CLASS, 0, 0, "ReferenceVirtual", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecState = (ebml_context) {0xA4, EBML_BINARY_CLASS, 0, 0, "CodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDiscardPadding = (ebml_context) {0x75A2, EBML_SINTEGER_CLASS, 0, 0, "DiscardPadding", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLaceNumber = (ebml_context) {0xCC, EBML_INTEGER_CLASS, 0, 0, "LaceNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFrameNumber = (ebml_context) {0xCD, EBML_INTEGER_CLASS, 1, 0, "FrameNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditionID = (ebml_context) {0xCB, EBML_INTEGER_CLASS, 1, 0, "BlockAdditionID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDelay = (ebml_context) {0xCE, EBML_INTEGER_CLASS, 1, 0, "Delay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSliceDuration = (ebml_context) {0xCF, EBML_INTEGER_CLASS, 1, 0, "SliceDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimeSlice = (ebml_context) {0xE8, EBML_MASTER_CLASS, 0, 0, "TimeSlice", EBML_SemanticTimeSlice, EBML_getSemanticGlobals()};
    MATROSKA_ContextSlices = (ebml_context) {0x8E, EBML_MASTER_CLASS, 0, 0, "Slices", EBML_SemanticSlices, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceOffset = (ebml_context) {0xC9, EBML_INTEGER_CLASS, 0, 0, "ReferenceOffset", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceTimestamp = (ebml_context) {0xCA, EBML_INTEGER_CLASS, 0, 0, "ReferenceTimestamp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceFrame = (ebml_context) {0xC8, EBML_MASTER_CLASS, 0, 0, "ReferenceFrame", EBML_SemanticReferenceFrame, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockGroup = (ebml_context) {0xA0, MATROSKA_BLOCKGROUP_CLASS, 0, 0, "BlockGroup", EBML_SemanticBlockGroup, EBML_getSemanticGlobals()};
    MATROSKA_ContextEncryptedBlock = (ebml_context) {0xAF, EBML_BINARY_CLASS, 0, 0, "EncryptedBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCluster = (ebml_context) {0x1F43B675, MATROSKA_CLUSTER_CLASS, 0, 0, "Cluster", EBML_SemanticCluster, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackNumber = (ebml_context) {0xD7, EBML_INTEGER_CLASS, 0, 0, "TrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackUID = (ebml_context) {0x73C5, EBML_INTEGER_CLASS, 0, 0, "TrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackType = (ebml_context) {0x83, EBML_INTEGER_CLASS, 0, 0, "TrackType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagEnabled = (ebml_context) {0xB9, EBML_BOOLEAN_CLASS, 1, 1, "FlagEnabled", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagDefault = (ebml_context) {0x88, EBML_BOOLEAN_CLASS, 1, 1, "FlagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagForced = (ebml_context) {0x55AA, EBML_BOOLEAN_CLASS, 1, 0, "FlagForced", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagHearingImpaired = (ebml_context) {0x55AB, EBML_BOOLEAN_CLASS, 0, 0, "FlagHearingImpaired", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagVisualImpaired = (ebml_context) {0x55AC, EBML_BOOLEAN_CLASS, 0, 0, "FlagVisualImpaired", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagTextDescriptions = (ebml_context) {0x55AD, EBML_BOOLEAN_CLASS, 0, 0, "FlagTextDescriptions", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagOriginal = (ebml_context) {0x55AE, EBML_BOOLEAN_CLASS, 0, 0, "FlagOriginal", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagCommentary = (ebml_context) {0x55AF, EBML_BOOLEAN_CLASS, 0, 0, "FlagCommentary", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagLacing = (ebml_context) {0x9C, EBML_BOOLEAN_CLASS, 1, 1, "FlagLacing", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMinCache = (ebml_context) {0x6DE7, EBML_INTEGER_CLASS, 1, 0, "MinCache", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxCache = (ebml_context) {0x6DF8, EBML_INTEGER_CLASS, 0, 0, "MaxCache", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDefaultDuration = (ebml_context) {0x23E383, EBML_INTEGER_CLASS, 0, 0, "DefaultDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDefaultDecodedFieldDuration = (ebml_context) {0x234E7A, EBML_INTEGER_CLASS, 0, 0, "DefaultDecodedFieldDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTimestampScale = (ebml_context) {0x23314F, EBML_FLOAT_CLASS, 1, 1, "TrackTimestampScale", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOffset = (ebml_context) {0x537F, EBML_SINTEGER_CLASS, 1, 0, "TrackOffset", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxBlockAdditionID = (ebml_context) {0x55EE, EBML_INTEGER_CLASS, 1, 0, "MaxBlockAdditionID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDValue = (ebml_context) {0x41F0, EBML_INTEGER_CLASS, 0, 0, "BlockAddIDValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDName = (ebml_context) {0x41A4, EBML_STRING_CLASS, 0, 0, "BlockAddIDName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDType = (ebml_context) {0x41E7, EBML_INTEGER_CLASS, 1, 0, "BlockAddIDType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDExtraData = (ebml_context) {0x41ED, EBML_BINARY_CLASS, 0, 0, "BlockAddIDExtraData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditionMapping = (ebml_context) {0x41E4, EBML_MASTER_CLASS, 0, 0, "BlockAdditionMapping", EBML_SemanticBlockAdditionMapping, EBML_getSemanticGlobals()};
    MATROSKA_ContextName = (ebml_context) {0x536E, EBML_UNISTRING_CLASS, 0, 0, "Name", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLanguage = (ebml_context) {0x22B59C, EBML_STRING_CLASS, 1, (intptr_t)"eng", "Language", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLanguageBCP47 = (ebml_context) {0x22B59D, EBML_STRING_CLASS, 0, 0, "LanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecID = (ebml_context) {0x86, EBML_STRING_CLASS, 0, 0, "CodecID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecPrivate = (ebml_context) {0x63A2, EBML_BINARY_CLASS, 0, 0, "CodecPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecName = (ebml_context) {0x258688, EBML_UNISTRING_CLASS, 0, 0, "CodecName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachmentLink = (ebml_context) {0x7446, EBML_INTEGER_CLASS, 0, 0, "AttachmentLink", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecSettings = (ebml_context) {0x3A9697, EBML_UNISTRING_CLASS, 0, 0, "CodecSettings", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecInfoURL = (ebml_context) {0x3B4040, EBML_STRING_CLASS, 0, 0, "CodecInfoURL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDownloadURL = (ebml_context) {0x26B240, EBML_STRING_CLASS, 0, 0, "CodecDownloadURL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDecodeAll = (ebml_context) {0xAA, EBML_BOOLEAN_CLASS, 1, 1, "CodecDecodeAll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOverlay = (ebml_context) {0x6FAB, EBML_INTEGER_CLASS, 0, 0, "TrackOverlay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDelay = (ebml_context) {0x56AA, EBML_INTEGER_CLASS, 1, 0, "CodecDelay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekPreRoll = (ebml_context) {0x56BB, EBML_INTEGER_CLASS, 1, 0, "SeekPreRoll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateTrackID = (ebml_context) {0x66A5, EBML_BINARY_CLASS, 0, 0, "TrackTranslateTrackID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateCodec = (ebml_context) {0x66BF, EBML_INTEGER_CLASS, 0, 0, "TrackTranslateCodec", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateEditionUID = (ebml_context) {0x66FC, EBML_INTEGER_CLASS, 0, 0, "TrackTranslateEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslate = (ebml_context) {0x6624, EBML_MASTER_CLASS, 0, 0, "TrackTranslate", EBML_SemanticTrackTranslate, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagInterlaced = (ebml_context) {0x9A, EBML_INTEGER_CLASS, 1, 0, "FlagInterlaced", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFieldOrder = (ebml_context) {0x9D, EBML_INTEGER_CLASS, 1, 2, "FieldOrder", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextStereoMode = (ebml_context) {0x53B8, EBML_INTEGER_CLASS, 1, 0, "StereoMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAlphaMode = (ebml_context) {0x53C0, EBML_INTEGER_CLASS, 1, 0, "AlphaMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextOldStereoMode = (ebml_context) {0x53B9, EBML_INTEGER_CLASS, 0, 0, "OldStereoMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelWidth = (ebml_context) {0xB0, EBML_INTEGER_CLASS, 0, 0, "PixelWidth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelHeight = (ebml_context) {0xBA, EBML_INTEGER_CLASS, 0, 0, "PixelHeight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropBottom = (ebml_context) {0x54AA, EBML_INTEGER_CLASS, 1, 0, "PixelCropBottom", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropTop = (ebml_context) {0x54BB, EBML_INTEGER_CLASS, 1, 0, "PixelCropTop", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropLeft = (ebml_context) {0x54CC, EBML_INTEGER_CLASS, 1, 0, "PixelCropLeft", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropRight = (ebml_context) {0x54DD, EBML_INTEGER_CLASS, 1, 0, "PixelCropRight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayWidth = (ebml_context) {0x54B0, EBML_INTEGER_CLASS, 0, 0, "DisplayWidth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayHeight = (ebml_context) {0x54BA, EBML_INTEGER_CLASS, 0, 0, "DisplayHeight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayUnit = (ebml_context) {0x54B2, EBML_INTEGER_CLASS, 1, 0, "DisplayUnit", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAspectRatioType = (ebml_context) {0x54B3, EBML_INTEGER_CLASS, 1, 0, "AspectRatioType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextUncompressedFourCC = (ebml_context) {0x2EB524, EBML_BINARY_CLASS, 0, 0, "UncompressedFourCC", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextGammaValue = (ebml_context) {0x2FB523, EBML_FLOAT_CLASS, 0, 0, "GammaValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFrameRate = (ebml_context) {0x2383E3, EBML_FLOAT_CLASS, 0, 0, "FrameRate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMatrixCoefficients = (ebml_context) {0x55B1, EBML_INTEGER_CLASS, 1, 2, "MatrixCoefficients", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBitsPerChannel = (ebml_context) {0x55B2, EBML_INTEGER_CLASS, 1, 0, "BitsPerChannel", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSubsamplingHorz = (ebml_context) {0x55B3, EBML_INTEGER_CLASS, 0, 0, "ChromaSubsamplingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSubsamplingVert = (ebml_context) {0x55B4, EBML_INTEGER_CLASS, 0, 0, "ChromaSubsamplingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCbSubsamplingHorz = (ebml_context) {0x55B5, EBML_INTEGER_CLASS, 0, 0, "CbSubsamplingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCbSubsamplingVert = (ebml_context) {0x55B6, EBML_INTEGER_CLASS, 0, 0, "CbSubsamplingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSitingHorz = (ebml_context) {0x55B7, EBML_INTEGER_CLASS, 1, 0, "ChromaSitingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSitingVert = (ebml_context) {0x55B8, EBML_INTEGER_CLASS, 1, 0, "ChromaSitingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextRange = (ebml_context) {0x55B9, EBML_INTEGER_CLASS, 1, 0, "Range", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTransferCharacteristics = (ebml_context) {0x55BA, EBML_INTEGER_CLASS, 1, 2, "TransferCharacteristics", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaries = (ebml_context) {0x55BB, EBML_INTEGER_CLASS, 1, 2, "Primaries", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxCLL = (ebml_context) {0x55BC, EBML_INTEGER_CLASS, 0, 0, "MaxCLL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxFALL = (ebml_context) {0x55BD, EBML_INTEGER_CLASS, 0, 0, "MaxFALL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryRChromaticityX = (ebml_context) {0x55D1, EBML_FLOAT_CLASS, 0, 0, "PrimaryRChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryRChromaticityY = (ebml_context) {0x55D2, EBML_FLOAT_CLASS, 0, 0, "PrimaryRChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryGChromaticityX = (ebml_context) {0x55D3, EBML_FLOAT_CLASS, 0, 0, "PrimaryGChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryGChromaticityY = (ebml_context) {0x55D4, EBML_FLOAT_CLASS, 0, 0, "PrimaryGChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryBChromaticityX = (ebml_context) {0x55D5, EBML_FLOAT_CLASS, 0, 0, "PrimaryBChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryBChromaticityY = (ebml_context) {0x55D6, EBML_FLOAT_CLASS, 0, 0, "PrimaryBChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWhitePointChromaticityX = (ebml_context) {0x55D7, EBML_FLOAT_CLASS, 0, 0, "WhitePointChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWhitePointChromaticityY = (ebml_context) {0x55D8, EBML_FLOAT_CLASS, 0, 0, "WhitePointChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLuminanceMax = (ebml_context) {0x55D9, EBML_FLOAT_CLASS, 0, 0, "LuminanceMax", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLuminanceMin = (ebml_context) {0x55DA, EBML_FLOAT_CLASS, 0, 0, "LuminanceMin", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMasteringMetadata = (ebml_context) {0x55D0, EBML_MASTER_CLASS, 0, 0, "MasteringMetadata", EBML_SemanticMasteringMetadata, EBML_getSemanticGlobals()};
    MATROSKA_ContextColour = (ebml_context) {0x55B0, EBML_MASTER_CLASS, 0, 0, "Colour", EBML_SemanticColour, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionType = (ebml_context) {0x7671, EBML_INTEGER_CLASS, 1, 0, "ProjectionType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPrivate = (ebml_context) {0x7672, EBML_BINARY_CLASS, 0, 0, "ProjectionPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPoseYaw = (ebml_context) {0x7673, EBML_FLOAT_CLASS, 1, 0, "ProjectionPoseYaw", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPosePitch = (ebml_context) {0x7674, EBML_FLOAT_CLASS, 1, 0, "ProjectionPosePitch", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPoseRoll = (ebml_context) {0x7675, EBML_FLOAT_CLASS, 1, 0, "ProjectionPoseRoll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjection = (ebml_context) {0x7670, EBML_MASTER_CLASS, 0, 0, "Projection", EBML_SemanticProjection, EBML_getSemanticGlobals()};
    MATROSKA_ContextVideo = (ebml_context) {0xE0, EBML_MASTER_CLASS, 0, 0, "Video", EBML_SemanticVideo, EBML_getSemanticGlobals()};
    MATROSKA_ContextSamplingFrequency = (ebml_context) {0xB5, EBML_FLOAT_CLASS, 1, 8000, "SamplingFrequency", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextOutputSamplingFrequency = (ebml_context) {0x78B5, EBML_FLOAT_CLASS, 0, 0, "OutputSamplingFrequency", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChannels = (ebml_context) {0x9F, EBML_INTEGER_CLASS, 1, 1, "Channels", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChannelPositions = (ebml_context) {0x7D7B, EBML_BINARY_CLASS, 0, 0, "ChannelPositions", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBitDepth = (ebml_context) {0x6264, EBML_INTEGER_CLASS, 0, 0, "BitDepth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEmphasis = (ebml_context) {0x52F1, EBML_INTEGER_CLASS, 1, 0, "Emphasis", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAudio = (ebml_context) {0xE1, EBML_MASTER_CLASS, 0, 0, "Audio", EBML_SemanticAudio, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlaneUID = (ebml_context) {0xE5, EBML_INTEGER_CLASS, 0, 0, "TrackPlaneUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlaneType = (ebml_context) {0xE6, EBML_INTEGER_CLASS, 0, 0, "TrackPlaneType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlane = (ebml_context) {0xE4, EBML_MASTER_CLASS, 0, 0, "TrackPlane", EBML_SemanticTrackPlane, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackCombinePlanes = (ebml_context) {0xE3, EBML_MASTER_CLASS, 0, 0, "TrackCombinePlanes", EBML_SemanticTrackCombinePlanes, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackJoinUID = (ebml_context) {0xED, EBML_INTEGER_CLASS, 0, 0, "TrackJoinUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackJoinBlocks = (ebml_context) {0xE9, EBML_MASTER_CLASS, 0, 0, "TrackJoinBlocks", EBML_SemanticTrackJoinBlocks, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOperation = (ebml_context) {0xE2, EBML_MASTER_CLASS, 0, 0, "TrackOperation", EBML_SemanticTrackOperation, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackUID = (ebml_context) {0xC0, EBML_INTEGER_CLASS, 0, 0, "TrickTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackSegmentUID = (ebml_context) {0xC1, MATROSKA_SEGMENTUID_CLASS, 0, 0, "TrickTrackSegmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackFlag = (ebml_context) {0xC6, EBML_INTEGER_CLASS, 1, 0, "TrickTrackFlag", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickMasterTrackUID = (ebml_context) {0xC7, EBML_INTEGER_CLASS, 0, 0, "TrickMasterTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickMasterTrackSegmentUID = (ebml_context) {0xC4, MATROSKA_SEGMENTUID_CLASS, 0, 0, "TrickMasterTrackSegmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingOrder = (ebml_context) {0x5031, EBML_INTEGER_CLASS, 1, 0, "ContentEncodingOrder", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingScope = (ebml_context) {0x5032, EBML_INTEGER_CLASS, 1, 1, "ContentEncodingScope", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingType = (ebml_context) {0x5033, EBML_INTEGER_CLASS, 1, 0, "ContentEncodingType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompAlgo = (ebml_context) {0x4254, EBML_INTEGER_CLASS, 1, 0, "ContentCompAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompSettings = (ebml_context) {0x4255, EBML_BINARY_CLASS, 0, 0, "ContentCompSettings", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompression = (ebml_context) {0x5034, EBML_MASTER_CLASS, 0, 0, "ContentCompression", EBML_SemanticContentCompression, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncAlgo = (ebml_context) {0x47E1, EBML_INTEGER_CLASS, 1, 0, "ContentEncAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncKeyID = (ebml_context) {0x47E2, EBML_BINARY_CLASS, 0, 0, "ContentEncKeyID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAESSettingsCipherMode = (ebml_context) {0x47E8, EBML_INTEGER_CLASS, 0, 0, "AESSettingsCipherMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncAESSettings = (ebml_context) {0x47E7, EBML_MASTER_CLASS, 0, 0, "ContentEncAESSettings", EBML_SemanticContentEncAESSettings, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSignature = (ebml_context) {0x47E3, EBML_BINARY_CLASS, 0, 0, "ContentSignature", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigKeyID = (ebml_context) {0x47E4, EBML_BINARY_CLASS, 0, 0, "ContentSigKeyID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigAlgo = (ebml_context) {0x47E5, EBML_INTEGER_CLASS, 1, 0, "ContentSigAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigHashAlgo = (ebml_context) {0x47E6, EBML_INTEGER_CLASS, 1, 0, "ContentSigHashAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncryption = (ebml_context) {0x5035, EBML_MASTER_CLASS, 0, 0, "ContentEncryption", EBML_SemanticContentEncryption, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncoding = (ebml_context) {0x6240, EBML_MASTER_CLASS, 0, 0, "ContentEncoding", EBML_SemanticContentEncoding, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodings = (ebml_context) {0x6D80, EBML_MASTER_CLASS, 0, 0, "ContentEncodings", EBML_SemanticContentEncodings, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackEntry = (ebml_context) {0xAE, MATROSKA_TRACKENTRY_CLASS, 0, 0, "TrackEntry", EBML_SemanticTrackEntry, EBML_getSemanticGlobals()};
    MATROSKA_ContextTracks = (ebml_context) {0x1654AE6B, EBML_MASTER_CLASS, 0, 0, "Tracks", EBML_SemanticTracks, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTime = (ebml_context) {0xB3, EBML_INTEGER_CLASS, 0, 0, "CueTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTrack = (ebml_context) {0xF7, EBML_INTEGER_CLASS, 0, 0, "CueTrack", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueClusterPosition = (ebml_context) {0xF1, EBML_INTEGER_CLASS, 0, 0, "CueClusterPosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRelativePosition = (ebml_context) {0xF0, EBML_INTEGER_CLASS, 0, 0, "CueRelativePosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueDuration = (ebml_context) {0xB2, EBML_INTEGER_CLASS, 0, 0, "CueDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueBlockNumber = (ebml_context) {0x5378, EBML_INTEGER_CLASS, 0, 0, "CueBlockNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueCodecState = (ebml_context) {0xEA, EBML_INTEGER_CLASS, 1, 0, "CueCodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefTime = (ebml_context) {0x96, EBML_INTEGER_CLASS, 0, 0, "CueRefTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefCluster = (ebml_context) {0x97, EBML_INTEGER_CLASS, 0, 0, "CueRefCluster", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefNumber = (ebml_context) {0x535F, EBML_INTEGER_CLASS, 1, 1, "CueRefNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefCodecState = (ebml_context) {0xEB, EBML_INTEGER_CLASS, 1, 0, "CueRefCodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueReference = (ebml_context) {0xDB, EBML_MASTER_CLASS, 0, 0, "CueReference", EBML_SemanticCueReference, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTrackPositions = (ebml_context) {0xB7, EBML_MASTER_CLASS, 0, 0, "CueTrackPositions", EBML_SemanticCueTrackPositions, EBML_getSemanticGlobals()};
    MATROSKA_ContextCuePoint = (ebml_context) {0xBB, MATROSKA_CUEPOINT_CLASS, 0, 0, "CuePoint", EBML_SemanticCuePoint, EBML_getSemanticGlobals()};
    MATROSKA_ContextCues = (ebml_context) {0x1C53BB6B, EBML_MASTER_CLASS, 0, 0, "Cues", EBML_SemanticCues, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileDescription = (ebml_context) {0x467E, EBML_UNISTRING_CLASS, 0, 0, "FileDescription", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileName = (ebml_context) {0x466E, EBML_UNISTRING_CLASS, 0, 0, "FileName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileMediaType = (ebml_context) {0x4660, EBML_STRING_CLASS, 0, 0, "FileMediaType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileData = (ebml_context) {0x465C, MATROSKA_BIGBINARY_CLASS, 0, 0, "FileData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUID = (ebml_context) {0x46AE, EBML_INTEGER_CLASS, 0, 0, "FileUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileReferral = (ebml_context) {0x4675, EBML_BINARY_CLASS, 0, 0, "FileReferral", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUsedStartTime = (ebml_context) {0x4661, EBML_INTEGER_CLASS, 0, 0, "FileUsedStartTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUsedEndTime = (ebml_context) {0x4662, EBML_INTEGER_CLASS, 0, 0, "FileUsedEndTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachedFile = (ebml_context) {0x61A7, MATROSKA_ATTACHMENT_CLASS, 0, 0, "AttachedFile", EBML_SemanticAttachedFile, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachments = (ebml_context) {0x1941A469, EBML_MASTER_CLASS, 0, 0, "Attachments", EBML_SemanticAttachments, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionUID = (ebml_context) {0x45BC, EBML_INTEGER_CLASS, 0, 0, "EditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagHidden = (ebml_context) {0x45BD, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagHidden", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagDefault = (ebml_context) {0x45DB, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagOrdered = (ebml_context) {0x45DD, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagOrdered", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionString = (ebml_context) {0x4521, EBML_UNISTRING_CLASS, 0, 0, "EditionString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionLanguageIETF = (ebml_context) {0x45E4, EBML_STRING_CLASS, 0, 0, "EditionLanguageIETF", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionDisplay = (ebml_context) {0x4520, EBML_MASTER_CLASS, 0, 0, "EditionDisplay", EBML_SemanticEditionDisplay, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterUID = (ebml_context) {0x73C4, EBML_INTEGER_CLASS, 0, 0, "ChapterUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterStringUID = (ebml_context) {0x5654, EBML_UNISTRING_CLASS, 0, 0, "ChapterStringUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTimeStart = (ebml_context) {0x91, EBML_INTEGER_CLASS, 0, 0, "ChapterTimeStart", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTimeEnd = (ebml_context) {0x92, EBML_INTEGER_CLASS, 0, 0, "ChapterTimeEnd", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterFlagHidden = (ebml_context) {0x98, EBML_BOOLEAN_CLASS, 1, 0, "ChapterFlagHidden", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterFlagEnabled = (ebml_context) {0x4598, EBML_BOOLEAN_CLASS, 1, 1, "ChapterFlagEnabled", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSegmentUUID = (ebml_context) {0x6E67, MATROSKA_SEGMENTUID_CLASS, 0, 0, "ChapterSegmentUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSkipType = (ebml_context) {0x4588, EBML_INTEGER_CLASS, 0, 0, "ChapterSkipType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSegmentEditionUID = (ebml_context) {0x6EBC, EBML_INTEGER_CLASS, 0, 0, "ChapterSegmentEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterPhysicalEquiv = (ebml_context) {0x63C3, EBML_INTEGER_CLASS, 0, 0, "ChapterPhysicalEquiv", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTrackNumber = (ebml_context) {0x89, EBML_INTEGER_CLASS, 0, 0, "ChapterTrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTrack = (ebml_context) {0x8F, EBML_MASTER_CLASS, 0, 0, "ChapterTrack", EBML_SemanticChapterTrack, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapString = (ebml_context) {0x85, EBML_UNISTRING_CLASS, 0, 0, "ChapString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapLanguage = (ebml_context) {0x437C, EBML_STRING_CLASS, 1, (intptr_t)"eng", "ChapLanguage", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapLanguageBCP47 = (ebml_context) {0x437D, EBML_STRING_CLASS, 0, 0, "ChapLanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapCountry = (ebml_context) {0x437E, EBML_STRING_CLASS, 0, 0, "ChapCountry", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterDisplay = (ebml_context) {0x80, EBML_MASTER_CLASS, 0, 0, "ChapterDisplay", EBML_SemanticChapterDisplay, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessCodecID = (ebml_context) {0x6955, EBML_INTEGER_CLASS, 1, 0, "ChapProcessCodecID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessPrivate = (ebml_context) {0x450D, EBML_BINARY_CLASS, 0, 0, "ChapProcessPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessTime = (ebml_context) {0x6922, EBML_INTEGER_CLASS, 0, 0, "ChapProcessTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessData = (ebml_context) {0x6933, EBML_BINARY_CLASS, 0, 0, "ChapProcessData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessCommand = (ebml_context) {0x6911, EBML_MASTER_CLASS, 0, 0, "ChapProcessCommand", EBML_SemanticChapProcessCommand, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcess = (ebml_context) {0x6944, EBML_MASTER_CLASS, 0, 0, "ChapProcess", EBML_SemanticChapProcess, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterAtom = (ebml_context) {0xB6, EBML_MASTER_CLASS, 0, 0, "ChapterAtom", EBML_SemanticChapterAtom, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionEntry = (ebml_context) {0x45B9, EBML_MASTER_CLASS, 0, 0, "EditionEntry", EBML_SemanticEditionEntry, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapters = (ebml_context) {0x1043A770, EBML_MASTER_CLASS, 0, 0, "Chapters", EBML_SemanticChapters, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargetTypeValue = (ebml_context) {0x68CA, EBML_INTEGER_CLASS, 1, 50, "TargetTypeValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargetType = (ebml_context) {0x63CA, EBML_STRING_CLASS, 0, 0, "TargetType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagTrackUID = (ebml_context) {0x63C5, EBML_INTEGER_CLASS, 1, 0, "TagTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagEditionUID = (ebml_context) {0x63C9, EBML_INTEGER_CLASS, 1, 0, "TagEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagChapterUID = (ebml_context) {0x63C4, EBML_INTEGER_CLASS, 1, 0, "TagChapterUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagAttachmentUID = (ebml_context) {0x63C6, EBML_INTEGER_CLASS, 1, 0, "TagAttachmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargets = (ebml_context) {0x63C0, EBML_MASTER_CLASS, 0, 0, "Targets", EBML_SemanticTargets, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagName = (ebml_context) {0x45A3, EBML_UNISTRING_CLASS, 0, 0, "TagName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagLanguage = (ebml_context) {0x447A, EBML_STRING_CLASS, 1, (intptr_t)"und", "TagLanguage", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagLanguageBCP47 = (ebml_context) {0x447B, EBML_STRING_CLASS, 0, 0, "TagLanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagDefault = (ebml_context) {0x4484, EBML_BOOLEAN_CLASS, 1, 1, "TagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagDefaultBogus = (ebml_context) {0x44B4, EBML_BOOLEAN_CLASS, 1, 1, "TagDefaultBogus", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagString = (ebml_context) {0x4487, EBML_UNISTRING_CLASS, 0, 0, "TagString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagBinary = (ebml_context) {0x4485, EBML_BINARY_CLASS, 0, 0, "TagBinary", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSimpleTag = (ebml_context) {0x67C8, EBML_MASTER_CLASS, 0, 0, "SimpleTag", EBML_SemanticSimpleTag, EBML_getSemanticGlobals()};
    MATROSKA_ContextTag = (ebml_context) {0x7373, EBML_MASTER_CLASS, 0, 0, "Tag", EBML_SemanticTag, EBML_getSemanticGlobals()};
    MATROSKA_ContextTags = (ebml_context) {0x1254C367, EBML_MASTER_CLASS, 0, 0, "Tags", EBML_SemanticTags, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegment = (ebml_context) {0x18538067, EBML_MASTER_CLASS, 0, 0, "Segment", EBML_SemanticSegment, EBML_getSemanticGlobals()};
}